

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-template-64.h
# Opt level: O3

void fill_block(block *prev_block,block *ref_block,block *next_block,int with_xor)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  ulong uVar115;
  ulong uVar116;
  ulong uVar117;
  ulong uVar118;
  ulong uVar119;
  ulong uVar120;
  ulong uVar121;
  ulong uVar122;
  ulong uVar123;
  ulong uVar124;
  ulong uVar125;
  ulong uVar126;
  ulong uVar127;
  ulong uVar128;
  ulong uVar129;
  ulong uVar130;
  ulong uVar131;
  ulong uVar132;
  ulong uVar133;
  ulong uVar134;
  ulong uVar135;
  ulong uVar136;
  ulong uVar137;
  ulong uVar138;
  ulong uVar139;
  ulong uVar140;
  ulong uVar141;
  ulong uVar142;
  ulong uVar143;
  ulong uVar144;
  ulong uVar145;
  ulong uVar146;
  ulong uVar147;
  ulong uVar148;
  ulong uVar149;
  ulong uVar150;
  ulong uVar151;
  ulong uVar152;
  ulong uVar153;
  ulong uVar154;
  ulong uVar155;
  ulong uVar156;
  ulong uVar157;
  ulong uVar158;
  ulong uVar159;
  ulong uVar160;
  ulong uVar161;
  ulong uVar162;
  ulong uVar163;
  ulong uVar164;
  ulong uVar165;
  ulong uVar166;
  ulong uVar167;
  ulong uVar168;
  ulong uVar169;
  ulong uVar170;
  ulong uVar171;
  ulong uVar172;
  ulong uVar173;
  ulong uVar174;
  ulong uVar175;
  ulong uVar176;
  ulong uVar177;
  ulong uVar178;
  ulong uVar179;
  ulong uVar180;
  ulong uVar181;
  ulong uVar182;
  ulong uVar183;
  ulong uVar184;
  ulong uVar185;
  ulong uVar186;
  ulong uVar187;
  ulong uVar188;
  ulong uVar189;
  ulong uVar190;
  ulong uVar191;
  ulong uVar192;
  ulong uVar193;
  block block_tmp;
  block local_830;
  block local_430;
  
  copy_block(&local_830,ref_block);
  xor_block(&local_830,prev_block);
  copy_block(&local_430,&local_830);
  if (with_xor != 0) {
    xor_block(&local_430,next_block);
  }
  uVar30 = (local_830.v[4] & 0xffffffff) * (local_830.v[0] & 0xffffffff) * 2 +
           local_830.v[4] + local_830.v[0];
  uVar7 = (local_830.v[0xc] ^ uVar30) >> 0x20;
  uVar63 = (local_830.v[0xc] ^ uVar30) << 0x20 | uVar7;
  uVar131 = uVar7 * (local_830.v[8] & 0xffffffff) * 2 + uVar63 + local_830.v[8];
  uVar7 = (local_830.v[4] ^ uVar131) >> 0x18;
  uVar178 = (local_830.v[4] ^ uVar131) << 0x28 | uVar7;
  uVar164 = (uVar7 & 0xffffffff) * (uVar30 & 0xffffffff) * 2 + uVar178 + uVar30;
  uVar63 = uVar63 ^ uVar164;
  uVar7 = uVar63 >> 0x10;
  uVar64 = uVar63 << 0x30 | uVar7;
  uVar63 = (local_830.v[5] & 0xffffffff) * (local_830.v[1] & 0xffffffff) * 2 +
           local_830.v[5] + local_830.v[1];
  uVar30 = (local_830.v[0xd] ^ uVar63) >> 0x20;
  uVar174 = (local_830.v[0xd] ^ uVar63) << 0x20 | uVar30;
  uVar132 = (uVar7 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + uVar64 + uVar131;
  uVar133 = uVar30 * (local_830.v[9] & 0xffffffff) * 2 + uVar174 + local_830.v[9];
  uVar7 = (local_830.v[5] ^ uVar133) >> 0x18;
  uVar131 = (local_830.v[5] ^ uVar133) << 0x28 | uVar7;
  uVar33 = (uVar7 & 0xffffffff) * (uVar63 & 0xffffffff) * 2 + uVar131 + uVar63;
  uVar174 = uVar174 ^ uVar33;
  uVar7 = uVar174 >> 0x10;
  uVar175 = uVar174 << 0x30 | uVar7;
  uVar133 = (uVar7 & 0xffffffff) * (uVar133 & 0xffffffff) * 2 + uVar175 + uVar133;
  uVar30 = (local_830.v[6] & 0xffffffff) * (local_830.v[2] & 0xffffffff) * 2 +
           local_830.v[6] + local_830.v[2];
  uVar7 = (local_830.v[0xe] ^ uVar30) >> 0x20;
  uVar63 = (local_830.v[0xe] ^ uVar30) << 0x20 | uVar7;
  uVar171 = uVar7 * (local_830.v[10] & 0xffffffff) * 2 + uVar63 + local_830.v[10];
  uVar7 = (local_830.v[6] ^ uVar171) >> 0x18;
  uVar174 = (local_830.v[6] ^ uVar171) << 0x28 | uVar7;
  uVar34 = (uVar7 & 0xffffffff) * (uVar30 & 0xffffffff) * 2 + uVar174 + uVar30;
  uVar63 = uVar63 ^ uVar34;
  uVar7 = uVar63 >> 0x10;
  uVar134 = uVar63 << 0x30 | uVar7;
  uVar70 = (local_830.v[7] & 0xffffffff) * (local_830.v[3] & 0xffffffff) * 2 +
           local_830.v[3] + local_830.v[7];
  uVar30 = (local_830.v[0xf] ^ uVar70) >> 0x20;
  uVar63 = (local_830.v[0xf] ^ uVar70) << 0x20 | uVar30;
  local_830.v[0xb] = uVar30 * (local_830.v[0xb] & 0xffffffff) * 2 + uVar63 + local_830.v[0xb];
  uVar30 = (local_830.v[7] ^ local_830.v[0xb]) >> 0x18;
  uVar150 = (local_830.v[7] ^ local_830.v[0xb]) << 0x28 | uVar30;
  uVar171 = (uVar7 & 0xffffffff) * (uVar171 & 0xffffffff) * 2 + uVar134 + uVar171;
  uVar70 = (uVar30 & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar150 + uVar70;
  uVar63 = uVar63 ^ uVar70;
  uVar7 = uVar63 >> 0x10;
  uVar63 = uVar63 << 0x30 | uVar7;
  uVar29 = (uVar7 & 0xffffffff) * (local_830.v[0xb] & 0xffffffff) * 2 + local_830.v[0xb] + uVar63;
  uVar131 = uVar131 ^ uVar133;
  uVar7 = uVar131 << 1;
  uVar30 = (ulong)((long)uVar131 < 0);
  uVar131 = uVar7 | uVar30;
  uVar164 = (uVar7 & 0xffffffff | uVar30) * (uVar164 & 0xffffffff) * 2 + uVar131 + uVar164;
  uVar63 = uVar63 ^ uVar164;
  uVar7 = uVar63 >> 0x20;
  uVar30 = uVar63 << 0x20 | uVar7;
  uVar174 = uVar174 ^ uVar171;
  uVar171 = uVar7 * (uVar171 & 0xffffffff) * 2 + uVar30 + uVar171;
  uVar131 = uVar131 ^ uVar171;
  uVar7 = uVar131 >> 0x18;
  uVar147 = uVar131 << 0x28 | uVar7;
  uVar71 = (uVar7 & 0xffffffff) * (uVar164 & 0xffffffff) * 2 + uVar164 + uVar147;
  uVar30 = uVar71 ^ uVar30;
  uVar8 = uVar30 >> 0x10;
  uVar72 = uVar30 << 0x30 | uVar8;
  uVar171 = (uVar8 & 0xffffffff) * (uVar171 & 0xffffffff) * 2 + uVar72 + uVar171;
  uVar178 = uVar178 ^ uVar132;
  uVar7 = uVar178 << 1;
  uVar131 = (ulong)((long)uVar178 < 0);
  uVar179 = uVar7 | uVar131;
  uVar30 = uVar174 << 1;
  uVar174 = (ulong)((long)uVar174 < 0);
  uVar178 = uVar30 | uVar174;
  uVar150 = uVar150 ^ uVar29;
  uVar63 = uVar150 << 1;
  uVar150 = (ulong)((long)uVar150 < 0);
  uVar151 = uVar63 | uVar150;
  uVar147 = uVar171 ^ uVar147;
  uVar164 = uVar147 << 1;
  uVar126 = (ulong)((long)uVar147 < 0);
  uVar33 = (uVar30 & 0xffffffff | uVar174) * (uVar33 & 0xffffffff) * 2 + uVar178 + uVar33;
  uVar64 = uVar64 ^ uVar33;
  uVar30 = uVar64 >> 0x20;
  uVar147 = uVar64 << 0x20 | uVar30;
  uVar174 = uVar30 * (uVar29 & 0xffffffff) * 2 + uVar29 + uVar147;
  uVar178 = uVar178 ^ uVar174;
  uVar30 = uVar178 >> 0x18;
  uVar29 = uVar178 << 0x28 | uVar30;
  uVar73 = (uVar30 & 0xffffffff) * (uVar33 & 0xffffffff) * 2 + uVar29 + uVar33;
  uVar147 = uVar73 ^ uVar147;
  uVar9 = uVar147 >> 0x10;
  uVar74 = uVar147 << 0x30 | uVar9;
  uVar35 = (uVar9 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar74 + uVar174;
  uVar29 = uVar35 ^ uVar29;
  uVar30 = uVar29 << 1;
  uVar1 = (ulong)((long)uVar29 < 0);
  uVar150 = (uVar63 & 0xffffffff | uVar150) * (uVar34 & 0xffffffff) * 2 + uVar151 + uVar34;
  uVar175 = uVar175 ^ uVar150;
  uVar63 = uVar175 >> 0x20;
  uVar29 = uVar175 << 0x20 | uVar63;
  uVar132 = uVar63 * (uVar132 & 0xffffffff) * 2 + uVar29 + uVar132;
  uVar151 = uVar151 ^ uVar132;
  uVar63 = uVar151 >> 0x18;
  uVar174 = uVar151 << 0x28 | uVar63;
  uVar75 = (uVar63 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + uVar174 + uVar150;
  uVar29 = uVar75 ^ uVar29;
  uVar10 = uVar29 >> 0x10;
  uVar76 = uVar29 << 0x30 | uVar10;
  uVar36 = (uVar10 & 0xffffffff) * (uVar132 & 0xffffffff) * 2 + uVar76 + uVar132;
  uVar174 = uVar36 ^ uVar174;
  uVar63 = uVar174 << 1;
  uVar2 = (ulong)((long)uVar174 < 0);
  uVar150 = (uVar7 & 0xffffffff | uVar131) * (uVar70 & 0xffffffff) * 2 + uVar70 + uVar179;
  uVar134 = uVar134 ^ uVar150;
  uVar7 = uVar134 >> 0x20;
  uVar29 = uVar134 << 0x20 | uVar7;
  uVar131 = uVar7 * (uVar133 & 0xffffffff) * 2 + uVar29 + uVar133;
  uVar179 = uVar179 ^ uVar131;
  uVar7 = uVar179 >> 0x18;
  uVar174 = uVar179 << 0x28 | uVar7;
  uVar77 = (uVar7 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + uVar174 + uVar150;
  uVar29 = uVar77 ^ uVar29;
  uVar11 = uVar29 >> 0x10;
  uVar78 = uVar29 << 0x30 | uVar11;
  uVar37 = (uVar11 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + uVar78 + uVar131;
  uVar174 = uVar37 ^ uVar174;
  uVar7 = uVar174 << 1;
  uVar143 = (ulong)((long)uVar174 < 0);
  uVar174 = (local_830.v[0x14] & 0xffffffff) * (local_830.v[0x10] & 0xffffffff) * 2 +
            local_830.v[0x14] + local_830.v[0x10];
  uVar131 = (local_830.v[0x1c] ^ uVar174) >> 0x20;
  uVar150 = (local_830.v[0x1c] ^ uVar174) << 0x20 | uVar131;
  uVar147 = uVar131 * (local_830.v[0x18] & 0xffffffff) * 2 + uVar150 + local_830.v[0x18];
  uVar131 = (local_830.v[0x14] ^ uVar147) >> 0x18;
  uVar180 = (local_830.v[0x14] ^ uVar147) << 0x28 | uVar131;
  uVar29 = (uVar131 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar180 + uVar174;
  uVar150 = uVar150 ^ uVar29;
  uVar131 = uVar150 >> 0x10;
  uVar151 = uVar150 << 0x30 | uVar131;
  uVar150 = (local_830.v[0x15] & 0xffffffff) * (local_830.v[0x11] & 0xffffffff) * 2 +
            local_830.v[0x15] + local_830.v[0x11];
  uVar174 = (local_830.v[0x1d] ^ uVar150) >> 0x20;
  uVar132 = (local_830.v[0x1d] ^ uVar150) << 0x20 | uVar174;
  uVar33 = (uVar131 & 0xffffffff) * (uVar147 & 0xffffffff) * 2 + uVar151 + uVar147;
  uVar70 = uVar174 * (local_830.v[0x19] & 0xffffffff) * 2 + uVar132 + local_830.v[0x19];
  uVar131 = (local_830.v[0x15] ^ uVar70) >> 0x18;
  uVar133 = (local_830.v[0x15] ^ uVar70) << 0x28 | uVar131;
  uVar178 = (uVar131 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + uVar133 + uVar150;
  uVar132 = uVar132 ^ uVar178;
  uVar131 = uVar132 >> 0x10;
  uVar179 = uVar132 << 0x30 | uVar131;
  uVar70 = (uVar131 & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar179 + uVar70;
  uVar174 = (local_830.v[0x16] & 0xffffffff) * (local_830.v[0x12] & 0xffffffff) * 2 +
            local_830.v[0x16] + local_830.v[0x12];
  uVar131 = (local_830.v[0x1e] ^ uVar174) >> 0x20;
  uVar132 = (local_830.v[0x1e] ^ uVar174) << 0x20 | uVar131;
  uVar150 = uVar131 * (local_830.v[0x1a] & 0xffffffff) * 2 + uVar132 + local_830.v[0x1a];
  uVar131 = (local_830.v[0x16] ^ uVar150) >> 0x18;
  uVar147 = (local_830.v[0x16] ^ uVar150) << 0x28 | uVar131;
  uVar134 = (uVar131 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar147 + uVar174;
  uVar132 = uVar132 ^ uVar134;
  uVar131 = uVar132 >> 0x10;
  uVar135 = uVar132 << 0x30 | uVar131;
  uVar175 = (local_830.v[0x17] & 0xffffffff) * (local_830.v[0x13] & 0xffffffff) * 2 +
            local_830.v[0x13] + local_830.v[0x17];
  uVar174 = (local_830.v[0x1f] ^ uVar175) >> 0x20;
  uVar132 = (local_830.v[0x1f] ^ uVar175) << 0x20 | uVar174;
  local_830.v[0x1b] = uVar174 * (local_830.v[0x1b] & 0xffffffff) * 2 + uVar132 + local_830.v[0x1b];
  uVar174 = (local_830.v[0x17] ^ local_830.v[0x1b]) >> 0x18;
  uVar152 = (local_830.v[0x17] ^ local_830.v[0x1b]) << 0x28 | uVar174;
  uVar150 = (uVar131 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + uVar135 + uVar150;
  uVar175 = (uVar174 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar152 + uVar175;
  uVar132 = uVar132 ^ uVar175;
  uVar131 = uVar132 >> 0x10;
  uVar132 = uVar132 << 0x30 | uVar131;
  uVar34 = (uVar131 & 0xffffffff) * (local_830.v[0x1b] & 0xffffffff) * 2 +
           local_830.v[0x1b] + uVar132;
  uVar133 = uVar133 ^ uVar70;
  uVar131 = uVar133 << 1;
  uVar174 = (ulong)((long)uVar133 < 0);
  uVar133 = uVar131 | uVar174;
  uVar29 = (uVar131 & 0xffffffff | uVar174) * (uVar29 & 0xffffffff) * 2 + uVar133 + uVar29;
  uVar132 = uVar132 ^ uVar29;
  uVar131 = uVar132 >> 0x20;
  uVar174 = uVar132 << 0x20 | uVar131;
  uVar147 = uVar147 ^ uVar150;
  uVar165 = uVar131 * (uVar150 & 0xffffffff) * 2 + uVar150 + uVar174;
  uVar133 = uVar133 ^ uVar165;
  uVar131 = uVar133 >> 0x18;
  uVar64 = uVar133 << 0x28 | uVar131;
  uVar79 = (uVar131 & 0xffffffff) * (uVar29 & 0xffffffff) * 2 + uVar29 + uVar64;
  uVar174 = uVar79 ^ uVar174;
  uVar12 = uVar174 >> 0x10;
  uVar80 = uVar174 << 0x30 | uVar12;
  uVar165 = (uVar12 & 0xffffffff) * (uVar165 & 0xffffffff) * 2 + uVar80 + uVar165;
  uVar180 = uVar180 ^ uVar33;
  uVar131 = uVar180 << 1;
  uVar132 = (ulong)((long)uVar180 < 0);
  uVar181 = uVar131 | uVar132;
  uVar174 = uVar147 << 1;
  uVar147 = (ulong)((long)uVar147 < 0);
  uVar180 = uVar174 | uVar147;
  uVar152 = uVar152 ^ uVar34;
  uVar150 = uVar152 << 1;
  uVar133 = (ulong)((long)uVar152 < 0);
  uVar152 = uVar150 | uVar133;
  uVar64 = uVar165 ^ uVar64;
  uVar29 = uVar64 << 1;
  uVar163 = (ulong)((long)uVar64 < 0);
  uVar178 = (uVar174 & 0xffffffff | uVar147) * (uVar178 & 0xffffffff) * 2 + uVar180 + uVar178;
  uVar151 = uVar151 ^ uVar178;
  uVar174 = uVar151 >> 0x20;
  uVar64 = uVar151 << 0x20 | uVar174;
  uVar147 = uVar174 * (uVar34 & 0xffffffff) * 2 + uVar34 + uVar64;
  uVar180 = uVar180 ^ uVar147;
  uVar174 = uVar180 >> 0x18;
  uVar34 = uVar180 << 0x28 | uVar174;
  uVar81 = (uVar174 & 0xffffffff) * (uVar178 & 0xffffffff) * 2 + uVar34 + uVar178;
  uVar64 = uVar81 ^ uVar64;
  uVar13 = uVar64 >> 0x10;
  uVar82 = uVar64 << 0x30 | uVar13;
  uVar38 = (uVar13 & 0xffffffff) * (uVar147 & 0xffffffff) * 2 + uVar82 + uVar147;
  uVar34 = uVar38 ^ uVar34;
  uVar174 = uVar34 << 1;
  uVar3 = (ulong)((long)uVar34 < 0);
  uVar133 = (uVar150 & 0xffffffff | uVar133) * (uVar134 & 0xffffffff) * 2 + uVar152 + uVar134;
  uVar179 = uVar179 ^ uVar133;
  uVar150 = uVar179 >> 0x20;
  uVar34 = uVar179 << 0x20 | uVar150;
  uVar33 = uVar150 * (uVar33 & 0xffffffff) * 2 + uVar34 + uVar33;
  uVar152 = uVar152 ^ uVar33;
  uVar150 = uVar152 >> 0x18;
  uVar147 = uVar152 << 0x28 | uVar150;
  uVar83 = (uVar150 & 0xffffffff) * (uVar133 & 0xffffffff) * 2 + uVar147 + uVar133;
  uVar34 = uVar83 ^ uVar34;
  uVar14 = uVar34 >> 0x10;
  uVar84 = uVar34 << 0x30 | uVar14;
  uVar39 = (uVar14 & 0xffffffff) * (uVar33 & 0xffffffff) * 2 + uVar84 + uVar33;
  uVar147 = uVar39 ^ uVar147;
  uVar150 = uVar147 << 1;
  uVar4 = (ulong)((long)uVar147 < 0);
  uVar133 = (uVar131 & 0xffffffff | uVar132) * (uVar175 & 0xffffffff) * 2 + uVar175 + uVar181;
  uVar135 = uVar135 ^ uVar133;
  uVar131 = uVar135 >> 0x20;
  uVar34 = uVar135 << 0x20 | uVar131;
  uVar132 = uVar131 * (uVar70 & 0xffffffff) * 2 + uVar34 + uVar70;
  uVar181 = uVar181 ^ uVar132;
  uVar131 = uVar181 >> 0x18;
  uVar147 = uVar181 << 0x28 | uVar131;
  uVar85 = (uVar131 & 0xffffffff) * (uVar133 & 0xffffffff) * 2 + uVar147 + uVar133;
  uVar34 = uVar85 ^ uVar34;
  uVar15 = uVar34 >> 0x10;
  uVar86 = uVar34 << 0x30 | uVar15;
  uVar40 = (uVar15 & 0xffffffff) * (uVar132 & 0xffffffff) * 2 + uVar86 + uVar132;
  uVar147 = uVar40 ^ uVar147;
  uVar131 = uVar147 << 1;
  uVar145 = (ulong)((long)uVar147 < 0);
  uVar147 = (local_830.v[0x24] & 0xffffffff) * (local_830.v[0x20] & 0xffffffff) * 2 +
            local_830.v[0x24] + local_830.v[0x20];
  uVar132 = (local_830.v[0x2c] ^ uVar147) >> 0x20;
  uVar133 = (local_830.v[0x2c] ^ uVar147) << 0x20 | uVar132;
  uVar64 = uVar132 * (local_830.v[0x28] & 0xffffffff) * 2 + uVar133 + local_830.v[0x28];
  uVar132 = (local_830.v[0x24] ^ uVar64) >> 0x18;
  uVar182 = (local_830.v[0x24] ^ uVar64) << 0x28 | uVar132;
  uVar34 = (uVar132 & 0xffffffff) * (uVar147 & 0xffffffff) * 2 + uVar182 + uVar147;
  uVar133 = uVar133 ^ uVar34;
  uVar132 = uVar133 >> 0x10;
  uVar180 = uVar133 << 0x30 | uVar132;
  uVar133 = (local_830.v[0x25] & 0xffffffff) * (local_830.v[0x21] & 0xffffffff) * 2 +
            local_830.v[0x25] + local_830.v[0x21];
  uVar147 = (local_830.v[0x2d] ^ uVar133) >> 0x20;
  uVar33 = (local_830.v[0x2d] ^ uVar133) << 0x20 | uVar147;
  uVar178 = (uVar132 & 0xffffffff) * (uVar64 & 0xffffffff) * 2 + uVar180 + uVar64;
  uVar175 = uVar147 * (local_830.v[0x29] & 0xffffffff) * 2 + uVar33 + local_830.v[0x29];
  uVar132 = (local_830.v[0x25] ^ uVar175) >> 0x18;
  uVar70 = (local_830.v[0x25] ^ uVar175) << 0x28 | uVar132;
  uVar135 = (uVar132 & 0xffffffff) * (uVar133 & 0xffffffff) * 2 + uVar70 + uVar133;
  uVar33 = uVar33 ^ uVar135;
  uVar132 = uVar33 >> 0x10;
  uVar181 = uVar33 << 0x30 | uVar132;
  uVar175 = (uVar132 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar181 + uVar175;
  uVar147 = (local_830.v[0x26] & 0xffffffff) * (local_830.v[0x22] & 0xffffffff) * 2 +
            local_830.v[0x26] + local_830.v[0x22];
  uVar132 = (local_830.v[0x2e] ^ uVar147) >> 0x20;
  uVar33 = (local_830.v[0x2e] ^ uVar147) << 0x20 | uVar132;
  uVar133 = uVar132 * (local_830.v[0x2a] & 0xffffffff) * 2 + uVar33 + local_830.v[0x2a];
  uVar132 = (local_830.v[0x26] ^ uVar133) >> 0x18;
  uVar64 = (local_830.v[0x26] ^ uVar133) << 0x28 | uVar132;
  uVar179 = (uVar132 & 0xffffffff) * (uVar147 & 0xffffffff) * 2 + uVar64 + uVar147;
  uVar33 = uVar33 ^ uVar179;
  uVar132 = uVar33 >> 0x10;
  uVar136 = uVar33 << 0x30 | uVar132;
  uVar152 = (local_830.v[0x27] & 0xffffffff) * (local_830.v[0x23] & 0xffffffff) * 2 +
            local_830.v[0x23] + local_830.v[0x27];
  uVar147 = (local_830.v[0x2f] ^ uVar152) >> 0x20;
  uVar33 = (local_830.v[0x2f] ^ uVar152) << 0x20 | uVar147;
  local_830.v[0x2b] = uVar147 * (local_830.v[0x2b] & 0xffffffff) * 2 + uVar33 + local_830.v[0x2b];
  uVar147 = (local_830.v[0x27] ^ local_830.v[0x2b]) >> 0x18;
  uVar153 = (local_830.v[0x27] ^ local_830.v[0x2b]) << 0x28 | uVar147;
  uVar133 = (uVar132 & 0xffffffff) * (uVar133 & 0xffffffff) * 2 + uVar136 + uVar133;
  uVar152 = (uVar147 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar153 + uVar152;
  uVar33 = uVar33 ^ uVar152;
  uVar132 = uVar33 >> 0x10;
  uVar33 = uVar33 << 0x30 | uVar132;
  uVar134 = (uVar132 & 0xffffffff) * (local_830.v[0x2b] & 0xffffffff) * 2 +
            local_830.v[0x2b] + uVar33;
  uVar70 = uVar70 ^ uVar175;
  uVar132 = uVar70 << 1;
  uVar147 = (ulong)((long)uVar70 < 0);
  uVar70 = uVar132 | uVar147;
  uVar34 = (uVar132 & 0xffffffff | uVar147) * (uVar34 & 0xffffffff) * 2 + uVar70 + uVar34;
  uVar33 = uVar33 ^ uVar34;
  uVar132 = uVar33 >> 0x20;
  uVar147 = uVar33 << 0x20 | uVar132;
  uVar64 = uVar64 ^ uVar133;
  uVar166 = uVar132 * (uVar133 & 0xffffffff) * 2 + uVar133 + uVar147;
  uVar70 = uVar70 ^ uVar166;
  uVar132 = uVar70 >> 0x18;
  uVar151 = uVar70 << 0x28 | uVar132;
  uVar87 = (uVar132 & 0xffffffff) * (uVar34 & 0xffffffff) * 2 + uVar34 + uVar151;
  uVar147 = uVar87 ^ uVar147;
  uVar16 = uVar147 >> 0x10;
  uVar88 = uVar147 << 0x30 | uVar16;
  uVar166 = (uVar16 & 0xffffffff) * (uVar166 & 0xffffffff) * 2 + uVar88 + uVar166;
  uVar182 = uVar182 ^ uVar178;
  uVar132 = uVar182 << 1;
  uVar33 = (ulong)((long)uVar182 < 0);
  uVar183 = uVar132 | uVar33;
  uVar147 = uVar64 << 1;
  uVar64 = (ulong)((long)uVar64 < 0);
  uVar182 = uVar147 | uVar64;
  uVar153 = uVar153 ^ uVar134;
  uVar133 = uVar153 << 1;
  uVar70 = (ulong)((long)uVar153 < 0);
  uVar153 = uVar133 | uVar70;
  uVar151 = uVar166 ^ uVar151;
  uVar34 = uVar151 << 1;
  uVar144 = (ulong)((long)uVar151 < 0);
  uVar31 = uVar34 | uVar144;
  uVar135 = (uVar147 & 0xffffffff | uVar64) * (uVar135 & 0xffffffff) * 2 + uVar182 + uVar135;
  uVar180 = uVar180 ^ uVar135;
  uVar147 = uVar180 >> 0x20;
  uVar151 = uVar180 << 0x20 | uVar147;
  uVar64 = uVar147 * (uVar134 & 0xffffffff) * 2 + uVar134 + uVar151;
  uVar182 = uVar182 ^ uVar64;
  uVar147 = uVar182 >> 0x18;
  uVar134 = uVar182 << 0x28 | uVar147;
  uVar89 = (uVar147 & 0xffffffff) * (uVar135 & 0xffffffff) * 2 + uVar134 + uVar135;
  uVar151 = uVar89 ^ uVar151;
  uVar17 = uVar151 >> 0x10;
  uVar90 = uVar151 << 0x30 | uVar17;
  uVar41 = (uVar17 & 0xffffffff) * (uVar64 & 0xffffffff) * 2 + uVar90 + uVar64;
  uVar134 = uVar41 ^ uVar134;
  uVar147 = uVar134 << 1;
  uVar5 = (ulong)((long)uVar134 < 0);
  uVar42 = uVar147 | uVar5;
  uVar70 = (uVar133 & 0xffffffff | uVar70) * (uVar179 & 0xffffffff) * 2 + uVar153 + uVar179;
  uVar181 = uVar181 ^ uVar70;
  uVar133 = uVar181 >> 0x20;
  uVar134 = uVar181 << 0x20 | uVar133;
  uVar178 = uVar133 * (uVar178 & 0xffffffff) * 2 + uVar134 + uVar178;
  uVar153 = uVar153 ^ uVar178;
  uVar133 = uVar153 >> 0x18;
  uVar64 = uVar153 << 0x28 | uVar133;
  uVar91 = (uVar133 & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar64 + uVar70;
  uVar134 = uVar91 ^ uVar134;
  uVar18 = uVar134 >> 0x10;
  uVar92 = uVar134 << 0x30 | uVar18;
  uVar43 = (uVar18 & 0xffffffff) * (uVar178 & 0xffffffff) * 2 + uVar92 + uVar178;
  uVar64 = uVar43 ^ uVar64;
  uVar133 = uVar64 << 1;
  uVar6 = (ulong)((long)uVar64 < 0);
  uVar44 = uVar133 | uVar6;
  uVar70 = (uVar132 & 0xffffffff | uVar33) * (uVar152 & 0xffffffff) * 2 + uVar152 + uVar183;
  uVar136 = uVar136 ^ uVar70;
  uVar132 = uVar136 >> 0x20;
  uVar134 = uVar136 << 0x20 | uVar132;
  uVar33 = uVar132 * (uVar175 & 0xffffffff) * 2 + uVar134 + uVar175;
  uVar183 = uVar183 ^ uVar33;
  uVar132 = uVar183 >> 0x18;
  uVar64 = uVar183 << 0x28 | uVar132;
  uVar93 = (uVar132 & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar64 + uVar70;
  uVar134 = uVar93 ^ uVar134;
  uVar19 = uVar134 >> 0x10;
  uVar94 = uVar134 << 0x30 | uVar19;
  uVar45 = (uVar19 & 0xffffffff) * (uVar33 & 0xffffffff) * 2 + uVar94 + uVar33;
  uVar64 = uVar45 ^ uVar64;
  uVar132 = uVar64 << 1;
  uVar125 = (ulong)((long)uVar64 < 0);
  uVar46 = uVar132 | uVar125;
  uVar64 = (local_830.v[0x34] & 0xffffffff) * (local_830.v[0x30] & 0xffffffff) * 2 +
           local_830.v[0x34] + local_830.v[0x30];
  uVar33 = (local_830.v[0x3c] ^ uVar64) >> 0x20;
  uVar70 = (local_830.v[0x3c] ^ uVar64) << 0x20 | uVar33;
  uVar151 = uVar33 * (local_830.v[0x38] & 0xffffffff) * 2 + uVar70 + local_830.v[0x38];
  uVar33 = (local_830.v[0x34] ^ uVar151) >> 0x18;
  uVar184 = (local_830.v[0x34] ^ uVar151) << 0x28 | uVar33;
  uVar134 = (uVar33 & 0xffffffff) * (uVar64 & 0xffffffff) * 2 + uVar184 + uVar64;
  uVar70 = uVar70 ^ uVar134;
  uVar33 = uVar70 >> 0x10;
  uVar182 = uVar70 << 0x30 | uVar33;
  uVar70 = (local_830.v[0x35] & 0xffffffff) * (local_830.v[0x31] & 0xffffffff) * 2 +
           local_830.v[0x35] + local_830.v[0x31];
  uVar64 = (local_830.v[0x3d] ^ uVar70) >> 0x20;
  uVar178 = (local_830.v[0x3d] ^ uVar70) << 0x20 | uVar64;
  uVar135 = (uVar33 & 0xffffffff) * (uVar151 & 0xffffffff) * 2 + uVar182 + uVar151;
  uVar152 = uVar64 * (local_830.v[0x39] & 0xffffffff) * 2 + uVar178 + local_830.v[0x39];
  uVar33 = (local_830.v[0x35] ^ uVar152) >> 0x18;
  uVar175 = (local_830.v[0x35] ^ uVar152) << 0x28 | uVar33;
  uVar136 = (uVar33 & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar175 + uVar70;
  uVar178 = uVar178 ^ uVar136;
  uVar33 = uVar178 >> 0x10;
  uVar183 = uVar178 << 0x30 | uVar33;
  uVar152 = (uVar33 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar183 + uVar152;
  uVar64 = (local_830.v[0x36] & 0xffffffff) * (local_830.v[0x32] & 0xffffffff) * 2 +
           local_830.v[0x36] + local_830.v[0x32];
  uVar33 = (local_830.v[0x3e] ^ uVar64) >> 0x20;
  uVar178 = (local_830.v[0x3e] ^ uVar64) << 0x20 | uVar33;
  uVar70 = uVar33 * (local_830.v[0x3a] & 0xffffffff) * 2 + uVar178 + local_830.v[0x3a];
  uVar33 = (local_830.v[0x36] ^ uVar70) >> 0x18;
  uVar151 = (local_830.v[0x36] ^ uVar70) << 0x28 | uVar33;
  uVar181 = (uVar33 & 0xffffffff) * (uVar64 & 0xffffffff) * 2 + uVar151 + uVar64;
  uVar178 = uVar178 ^ uVar181;
  uVar33 = uVar178 >> 0x10;
  uVar137 = uVar178 << 0x30 | uVar33;
  uVar153 = (local_830.v[0x37] & 0xffffffff) * (local_830.v[0x33] & 0xffffffff) * 2 +
            local_830.v[0x33] + local_830.v[0x37];
  uVar64 = (local_830.v[0x3f] ^ uVar153) >> 0x20;
  uVar178 = (local_830.v[0x3f] ^ uVar153) << 0x20 | uVar64;
  local_830.v[0x3b] = uVar64 * (local_830.v[0x3b] & 0xffffffff) * 2 + uVar178 + local_830.v[0x3b];
  uVar64 = (local_830.v[0x37] ^ local_830.v[0x3b]) >> 0x18;
  uVar154 = (local_830.v[0x37] ^ local_830.v[0x3b]) << 0x28 | uVar64;
  uVar70 = (uVar33 & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar137 + uVar70;
  uVar153 = (uVar64 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar154 + uVar153;
  uVar178 = uVar178 ^ uVar153;
  uVar33 = uVar178 >> 0x10;
  uVar178 = uVar178 << 0x30 | uVar33;
  uVar179 = (uVar33 & 0xffffffff) * (local_830.v[0x3b] & 0xffffffff) * 2 +
            local_830.v[0x3b] + uVar178;
  uVar175 = uVar175 ^ uVar152;
  uVar33 = uVar175 << 1;
  uVar64 = (ulong)((long)uVar175 < 0);
  uVar175 = uVar33 | uVar64;
  uVar134 = (uVar33 & 0xffffffff | uVar64) * (uVar134 & 0xffffffff) * 2 + uVar175 + uVar134;
  uVar178 = uVar178 ^ uVar134;
  uVar33 = uVar178 >> 0x20;
  uVar64 = uVar178 << 0x20 | uVar33;
  uVar151 = uVar151 ^ uVar70;
  uVar167 = uVar33 * (uVar70 & 0xffffffff) * 2 + uVar70 + uVar64;
  uVar175 = uVar175 ^ uVar167;
  uVar33 = uVar175 >> 0x18;
  uVar180 = uVar175 << 0x28 | uVar33;
  uVar95 = (uVar33 & 0xffffffff) * (uVar134 & 0xffffffff) * 2 + uVar134 + uVar180;
  uVar64 = uVar95 ^ uVar64;
  uVar20 = uVar64 >> 0x10;
  uVar96 = uVar64 << 0x30 | uVar20;
  uVar167 = (uVar20 & 0xffffffff) * (uVar167 & 0xffffffff) * 2 + uVar96 + uVar167;
  uVar184 = uVar184 ^ uVar135;
  uVar33 = uVar184 << 1;
  uVar178 = (ulong)((long)uVar184 < 0);
  uVar185 = uVar33 | uVar178;
  uVar64 = uVar151 << 1;
  uVar151 = (ulong)((long)uVar151 < 0);
  uVar184 = uVar64 | uVar151;
  uVar154 = uVar154 ^ uVar179;
  uVar70 = uVar154 << 1;
  uVar175 = (ulong)((long)uVar154 < 0);
  uVar155 = uVar70 | uVar175;
  uVar180 = uVar167 ^ uVar180;
  uVar134 = uVar180 << 1;
  uVar154 = (ulong)((long)uVar180 < 0);
  uVar32 = uVar134 | uVar154;
  uVar136 = (uVar64 & 0xffffffff | uVar151) * (uVar136 & 0xffffffff) * 2 + uVar184 + uVar136;
  uVar182 = uVar182 ^ uVar136;
  uVar64 = uVar182 >> 0x20;
  uVar180 = uVar182 << 0x20 | uVar64;
  uVar151 = uVar64 * (uVar179 & 0xffffffff) * 2 + uVar179 + uVar180;
  uVar184 = uVar184 ^ uVar151;
  uVar64 = uVar184 >> 0x18;
  uVar179 = uVar184 << 0x28 | uVar64;
  uVar97 = (uVar64 & 0xffffffff) * (uVar136 & 0xffffffff) * 2 + uVar179 + uVar136;
  uVar180 = uVar97 ^ uVar180;
  uVar21 = uVar180 >> 0x10;
  uVar98 = uVar180 << 0x30 | uVar21;
  uVar47 = (uVar21 & 0xffffffff) * (uVar151 & 0xffffffff) * 2 + uVar98 + uVar151;
  uVar179 = uVar47 ^ uVar179;
  uVar64 = uVar179 << 1;
  uVar184 = (ulong)((long)uVar179 < 0);
  uVar48 = uVar64 | uVar184;
  uVar175 = (uVar70 & 0xffffffff | uVar175) * (uVar181 & 0xffffffff) * 2 + uVar155 + uVar181;
  uVar183 = uVar183 ^ uVar175;
  uVar70 = uVar183 >> 0x20;
  uVar179 = uVar183 << 0x20 | uVar70;
  uVar135 = uVar70 * (uVar135 & 0xffffffff) * 2 + uVar179 + uVar135;
  uVar155 = uVar155 ^ uVar135;
  uVar70 = uVar155 >> 0x18;
  uVar151 = uVar155 << 0x28 | uVar70;
  uVar99 = (uVar70 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar151 + uVar175;
  uVar179 = uVar99 ^ uVar179;
  uVar22 = uVar179 >> 0x10;
  uVar100 = uVar179 << 0x30 | uVar22;
  uVar49 = (uVar22 & 0xffffffff) * (uVar135 & 0xffffffff) * 2 + uVar100 + uVar135;
  uVar151 = uVar49 ^ uVar151;
  uVar70 = uVar151 << 1;
  uVar155 = (ulong)((long)uVar151 < 0);
  uVar50 = uVar70 | uVar155;
  uVar175 = (uVar33 & 0xffffffff | uVar178) * (uVar153 & 0xffffffff) * 2 + uVar153 + uVar185;
  uVar137 = uVar137 ^ uVar175;
  uVar33 = uVar137 >> 0x20;
  uVar179 = uVar137 << 0x20 | uVar33;
  uVar178 = uVar33 * (uVar152 & 0xffffffff) * 2 + uVar179 + uVar152;
  uVar185 = uVar185 ^ uVar178;
  uVar33 = uVar185 >> 0x18;
  uVar151 = uVar185 << 0x28 | uVar33;
  uVar101 = (uVar33 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar151 + uVar175;
  uVar179 = uVar101 ^ uVar179;
  uVar23 = uVar179 >> 0x10;
  uVar102 = uVar179 << 0x30 | uVar23;
  uVar51 = (uVar23 & 0xffffffff) * (uVar178 & 0xffffffff) * 2 + uVar102 + uVar178;
  uVar151 = uVar51 ^ uVar151;
  uVar33 = uVar151 << 1;
  uVar137 = (ulong)((long)uVar151 < 0);
  uVar52 = uVar33 | uVar137;
  uVar151 = (local_830.v[0x44] & 0xffffffff) * (local_830.v[0x40] & 0xffffffff) * 2 +
            local_830.v[0x44] + local_830.v[0x40];
  uVar178 = (local_830.v[0x4c] ^ uVar151) >> 0x20;
  uVar175 = (local_830.v[0x4c] ^ uVar151) << 0x20 | uVar178;
  uVar180 = uVar178 * (local_830.v[0x48] & 0xffffffff) * 2 + uVar175 + local_830.v[0x48];
  uVar178 = (local_830.v[0x44] ^ uVar180) >> 0x18;
  uVar186 = (local_830.v[0x44] ^ uVar180) << 0x28 | uVar178;
  uVar179 = (uVar178 & 0xffffffff) * (uVar151 & 0xffffffff) * 2 + uVar186 + uVar151;
  uVar175 = uVar175 ^ uVar179;
  uVar178 = uVar175 >> 0x10;
  uVar65 = uVar175 << 0x30 | uVar178;
  uVar175 = (local_830.v[0x45] & 0xffffffff) * (local_830.v[0x41] & 0xffffffff) * 2 +
            local_830.v[0x45] + local_830.v[0x41];
  uVar151 = (local_830.v[0x4d] ^ uVar175) >> 0x20;
  uVar135 = (local_830.v[0x4d] ^ uVar175) << 0x20 | uVar151;
  uVar136 = (uVar178 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar65 + uVar180;
  uVar153 = uVar151 * (local_830.v[0x49] & 0xffffffff) * 2 + uVar135 + local_830.v[0x49];
  uVar178 = (local_830.v[0x45] ^ uVar153) >> 0x18;
  uVar152 = (local_830.v[0x45] ^ uVar153) << 0x28 | uVar178;
  uVar53 = (uVar178 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar152 + uVar175;
  uVar135 = uVar135 ^ uVar53;
  uVar178 = uVar135 >> 0x10;
  uVar127 = uVar135 << 0x30 | uVar178;
  uVar153 = (uVar178 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar127 + uVar153;
  uVar151 = (local_830.v[0x46] & 0xffffffff) * (local_830.v[0x42] & 0xffffffff) * 2 +
            local_830.v[0x46] + local_830.v[0x42];
  uVar178 = (local_830.v[0x4e] ^ uVar151) >> 0x20;
  uVar135 = (local_830.v[0x4e] ^ uVar151) << 0x20 | uVar178;
  uVar175 = uVar178 * (local_830.v[0x4a] & 0xffffffff) * 2 + uVar135 + local_830.v[0x4a];
  uVar178 = (local_830.v[0x46] ^ uVar175) >> 0x18;
  uVar180 = (local_830.v[0x46] ^ uVar175) << 0x28 | uVar178;
  uVar183 = (uVar178 & 0xffffffff) * (uVar151 & 0xffffffff) * 2 + uVar180 + uVar151;
  uVar135 = uVar135 ^ uVar183;
  uVar178 = uVar135 >> 0x10;
  uVar138 = uVar135 << 0x30 | uVar178;
  uVar103 = (local_830.v[0x47] & 0xffffffff) * (local_830.v[0x43] & 0xffffffff) * 2 +
            local_830.v[0x43] + local_830.v[0x47];
  uVar151 = (local_830.v[0x4f] ^ uVar103) >> 0x20;
  uVar135 = (local_830.v[0x4f] ^ uVar103) << 0x20 | uVar151;
  local_830.v[0x4b] = uVar151 * (local_830.v[0x4b] & 0xffffffff) * 2 + uVar135 + local_830.v[0x4b];
  uVar151 = (local_830.v[0x47] ^ local_830.v[0x4b]) >> 0x18;
  uVar185 = (local_830.v[0x47] ^ local_830.v[0x4b]) << 0x28 | uVar151;
  uVar175 = (uVar178 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar138 + uVar175;
  uVar103 = (uVar151 & 0xffffffff) * (uVar103 & 0xffffffff) * 2 + uVar185 + uVar103;
  uVar135 = uVar135 ^ uVar103;
  uVar178 = uVar135 >> 0x10;
  uVar135 = uVar135 << 0x30 | uVar178;
  uVar181 = (uVar178 & 0xffffffff) * (local_830.v[0x4b] & 0xffffffff) * 2 +
            local_830.v[0x4b] + uVar135;
  uVar152 = uVar152 ^ uVar153;
  uVar178 = uVar152 << 1;
  uVar151 = (ulong)((long)uVar152 < 0);
  uVar152 = uVar178 | uVar151;
  uVar179 = (uVar178 & 0xffffffff | uVar151) * (uVar179 & 0xffffffff) * 2 + uVar152 + uVar179;
  uVar135 = uVar135 ^ uVar179;
  uVar178 = uVar135 >> 0x20;
  uVar151 = uVar135 << 0x20 | uVar178;
  uVar180 = uVar180 ^ uVar175;
  uVar168 = uVar178 * (uVar175 & 0xffffffff) * 2 + uVar175 + uVar151;
  uVar152 = uVar152 ^ uVar168;
  uVar178 = uVar152 >> 0x18;
  uVar182 = uVar152 << 0x28 | uVar178;
  uVar104 = (uVar178 & 0xffffffff) * (uVar179 & 0xffffffff) * 2 + uVar179 + uVar182;
  uVar151 = uVar104 ^ uVar151;
  uVar24 = uVar151 >> 0x10;
  uVar105 = uVar151 << 0x30 | uVar24;
  uVar168 = (uVar24 & 0xffffffff) * (uVar168 & 0xffffffff) * 2 + uVar105 + uVar168;
  uVar186 = uVar186 ^ uVar136;
  uVar178 = uVar186 << 1;
  uVar135 = (ulong)((long)uVar186 < 0);
  uVar187 = uVar178 | uVar135;
  uVar151 = uVar180 << 1;
  uVar180 = (ulong)((long)uVar180 < 0);
  uVar186 = uVar151 | uVar180;
  uVar185 = uVar185 ^ uVar181;
  uVar175 = uVar185 << 1;
  uVar152 = (ulong)((long)uVar185 < 0);
  uVar156 = uVar175 | uVar152;
  uVar182 = uVar168 ^ uVar182;
  uVar179 = uVar182 << 1;
  uVar185 = (ulong)((long)uVar182 < 0);
  uVar53 = (uVar151 & 0xffffffff | uVar180) * (uVar53 & 0xffffffff) * 2 + uVar186 + uVar53;
  uVar65 = uVar65 ^ uVar53;
  uVar151 = uVar65 >> 0x20;
  uVar182 = uVar65 << 0x20 | uVar151;
  uVar180 = uVar151 * (uVar181 & 0xffffffff) * 2 + uVar181 + uVar182;
  uVar186 = uVar186 ^ uVar180;
  uVar151 = uVar186 >> 0x18;
  uVar181 = uVar186 << 0x28 | uVar151;
  uVar106 = (uVar151 & 0xffffffff) * (uVar53 & 0xffffffff) * 2 + uVar181 + uVar53;
  uVar182 = uVar106 ^ uVar182;
  uVar25 = uVar182 >> 0x10;
  uVar107 = uVar182 << 0x30 | uVar25;
  uVar54 = (uVar25 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar107 + uVar180;
  uVar181 = uVar54 ^ uVar181;
  uVar151 = uVar181 << 1;
  uVar53 = (ulong)((long)uVar181 < 0);
  uVar152 = (uVar175 & 0xffffffff | uVar152) * (uVar183 & 0xffffffff) * 2 + uVar156 + uVar183;
  uVar127 = uVar127 ^ uVar152;
  uVar175 = uVar127 >> 0x20;
  uVar181 = uVar127 << 0x20 | uVar175;
  uVar136 = uVar175 * (uVar136 & 0xffffffff) * 2 + uVar181 + uVar136;
  uVar156 = uVar156 ^ uVar136;
  uVar175 = uVar156 >> 0x18;
  uVar180 = uVar156 << 0x28 | uVar175;
  uVar108 = (uVar175 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar180 + uVar152;
  uVar181 = uVar108 ^ uVar181;
  uVar26 = uVar181 >> 0x10;
  uVar109 = uVar181 << 0x30 | uVar26;
  uVar55 = (uVar26 & 0xffffffff) * (uVar136 & 0xffffffff) * 2 + uVar109 + uVar136;
  uVar180 = uVar55 ^ uVar180;
  uVar175 = uVar180 << 1;
  uVar65 = (ulong)((long)uVar180 < 0);
  uVar152 = (uVar178 & 0xffffffff | uVar135) * (uVar103 & 0xffffffff) * 2 + uVar103 + uVar187;
  uVar138 = uVar138 ^ uVar152;
  uVar178 = uVar138 >> 0x20;
  uVar181 = uVar138 << 0x20 | uVar178;
  uVar135 = uVar178 * (uVar153 & 0xffffffff) * 2 + uVar181 + uVar153;
  uVar187 = uVar187 ^ uVar135;
  uVar178 = uVar187 >> 0x18;
  uVar180 = uVar187 << 0x28 | uVar178;
  uVar110 = (uVar178 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar180 + uVar152;
  uVar181 = uVar110 ^ uVar181;
  uVar27 = uVar181 >> 0x10;
  uVar111 = uVar181 << 0x30 | uVar27;
  uVar56 = (uVar27 & 0xffffffff) * (uVar135 & 0xffffffff) * 2 + uVar111 + uVar135;
  uVar180 = uVar56 ^ uVar180;
  uVar178 = uVar180 << 1;
  uVar103 = (ulong)((long)uVar180 < 0);
  uVar180 = (local_830.v[0x54] & 0xffffffff) * (local_830.v[0x50] & 0xffffffff) * 2 +
            local_830.v[0x54] + local_830.v[0x50];
  uVar135 = (local_830.v[0x5c] ^ uVar180) >> 0x20;
  uVar152 = (local_830.v[0x5c] ^ uVar180) << 0x20 | uVar135;
  uVar182 = uVar135 * (local_830.v[0x58] & 0xffffffff) * 2 + uVar152 + local_830.v[0x58];
  uVar135 = (local_830.v[0x54] ^ uVar182) >> 0x18;
  uVar188 = (local_830.v[0x54] ^ uVar182) << 0x28 | uVar135;
  uVar181 = (uVar135 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar188 + uVar180;
  uVar152 = uVar152 ^ uVar181;
  uVar135 = uVar152 >> 0x10;
  uVar66 = uVar152 << 0x30 | uVar135;
  uVar152 = (local_830.v[0x55] & 0xffffffff) * (local_830.v[0x51] & 0xffffffff) * 2 +
            local_830.v[0x55] + local_830.v[0x51];
  uVar180 = (local_830.v[0x5d] ^ uVar152) >> 0x20;
  uVar136 = (local_830.v[0x5d] ^ uVar152) << 0x20 | uVar180;
  uVar186 = (uVar135 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar66 + uVar182;
  uVar156 = uVar180 * (local_830.v[0x59] & 0xffffffff) * 2 + uVar136 + local_830.v[0x59];
  uVar135 = (local_830.v[0x55] ^ uVar156) >> 0x18;
  uVar153 = (local_830.v[0x55] ^ uVar156) << 0x28 | uVar135;
  uVar138 = (uVar135 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar153 + uVar152;
  uVar136 = uVar136 ^ uVar138;
  uVar135 = uVar136 >> 0x10;
  uVar128 = uVar136 << 0x30 | uVar135;
  uVar156 = (uVar135 & 0xffffffff) * (uVar156 & 0xffffffff) * 2 + uVar128 + uVar156;
  uVar180 = (local_830.v[0x56] & 0xffffffff) * (local_830.v[0x52] & 0xffffffff) * 2 +
            local_830.v[0x56] + local_830.v[0x52];
  uVar135 = (local_830.v[0x5e] ^ uVar180) >> 0x20;
  uVar136 = (local_830.v[0x5e] ^ uVar180) << 0x20 | uVar135;
  uVar152 = uVar135 * (local_830.v[0x5a] & 0xffffffff) * 2 + uVar136 + local_830.v[0x5a];
  uVar135 = (local_830.v[0x56] ^ uVar152) >> 0x18;
  uVar182 = (local_830.v[0x56] ^ uVar152) << 0x28 | uVar135;
  uVar187 = (uVar135 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar182 + uVar180;
  uVar136 = uVar136 ^ uVar187;
  uVar135 = uVar136 >> 0x10;
  uVar139 = uVar136 << 0x30 | uVar135;
  uVar112 = (local_830.v[0x57] & 0xffffffff) * (local_830.v[0x53] & 0xffffffff) * 2 +
            local_830.v[0x53] + local_830.v[0x57];
  uVar180 = (local_830.v[0x5f] ^ uVar112) >> 0x20;
  uVar136 = (local_830.v[0x5f] ^ uVar112) << 0x20 | uVar180;
  local_830.v[0x5b] = uVar180 * (local_830.v[0x5b] & 0xffffffff) * 2 + uVar136 + local_830.v[0x5b];
  uVar180 = (local_830.v[0x57] ^ local_830.v[0x5b]) >> 0x18;
  uVar157 = (local_830.v[0x57] ^ local_830.v[0x5b]) << 0x28 | uVar180;
  uVar152 = (uVar135 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar139 + uVar152;
  uVar112 = (uVar180 & 0xffffffff) * (uVar112 & 0xffffffff) * 2 + uVar157 + uVar112;
  uVar136 = uVar136 ^ uVar112;
  uVar135 = uVar136 >> 0x10;
  uVar136 = uVar136 << 0x30 | uVar135;
  uVar183 = (uVar135 & 0xffffffff) * (local_830.v[0x5b] & 0xffffffff) * 2 +
            local_830.v[0x5b] + uVar136;
  uVar153 = uVar153 ^ uVar156;
  uVar135 = uVar153 << 1;
  uVar180 = (ulong)((long)uVar153 < 0);
  uVar153 = uVar135 | uVar180;
  uVar181 = (uVar135 & 0xffffffff | uVar180) * (uVar181 & 0xffffffff) * 2 + uVar153 + uVar181;
  uVar136 = uVar136 ^ uVar181;
  uVar135 = uVar136 >> 0x20;
  uVar180 = uVar136 << 0x20 | uVar135;
  uVar182 = uVar182 ^ uVar152;
  uVar169 = uVar135 * (uVar152 & 0xffffffff) * 2 + uVar152 + uVar180;
  uVar153 = uVar153 ^ uVar169;
  uVar135 = uVar153 >> 0x18;
  uVar127 = uVar153 << 0x28 | uVar135;
  uVar113 = (uVar135 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar181 + uVar127;
  uVar180 = uVar113 ^ uVar180;
  uVar28 = uVar180 >> 0x10;
  uVar114 = uVar180 << 0x30 | uVar28;
  uVar169 = (uVar28 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + uVar114 + uVar169;
  uVar188 = uVar188 ^ uVar186;
  uVar135 = uVar188 << 1;
  uVar136 = (ulong)((long)uVar188 < 0);
  uVar189 = uVar135 | uVar136;
  uVar180 = uVar182 << 1;
  uVar182 = (ulong)((long)uVar182 < 0);
  uVar188 = uVar180 | uVar182;
  uVar157 = uVar157 ^ uVar183;
  uVar152 = uVar157 << 1;
  uVar153 = (ulong)((long)uVar157 < 0);
  uVar157 = uVar152 | uVar153;
  uVar127 = uVar169 ^ uVar127;
  uVar181 = uVar127 << 1;
  uVar127 = (ulong)((long)uVar127 < 0);
  uVar138 = (uVar180 & 0xffffffff | uVar182) * (uVar138 & 0xffffffff) * 2 + uVar188 + uVar138;
  uVar66 = uVar66 ^ uVar138;
  uVar180 = uVar66 >> 0x20;
  uVar66 = uVar66 << 0x20 | uVar180;
  uVar182 = uVar180 * (uVar183 & 0xffffffff) * 2 + uVar183 + uVar66;
  uVar188 = uVar188 ^ uVar182;
  uVar180 = uVar188 >> 0x18;
  uVar183 = uVar188 << 0x28 | uVar180;
  uVar115 = (uVar180 & 0xffffffff) * (uVar138 & 0xffffffff) * 2 + uVar183 + uVar138;
  uVar66 = uVar115 ^ uVar66;
  uVar188 = uVar66 >> 0x10;
  uVar116 = uVar66 << 0x30 | uVar188;
  uVar57 = (uVar188 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar116 + uVar182;
  uVar183 = uVar57 ^ uVar183;
  uVar180 = uVar183 << 1;
  uVar138 = (ulong)((long)uVar183 < 0);
  uVar153 = (uVar152 & 0xffffffff | uVar153) * (uVar187 & 0xffffffff) * 2 + uVar157 + uVar187;
  uVar128 = uVar128 ^ uVar153;
  uVar152 = uVar128 >> 0x20;
  uVar183 = uVar128 << 0x20 | uVar152;
  uVar186 = uVar152 * (uVar186 & 0xffffffff) * 2 + uVar183 + uVar186;
  uVar157 = uVar157 ^ uVar186;
  uVar152 = uVar157 >> 0x18;
  uVar182 = uVar157 << 0x28 | uVar152;
  uVar117 = (uVar152 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar182 + uVar153;
  uVar183 = uVar117 ^ uVar183;
  uVar157 = uVar183 >> 0x10;
  uVar118 = uVar183 << 0x30 | uVar157;
  uVar58 = (uVar157 & 0xffffffff) * (uVar186 & 0xffffffff) * 2 + uVar118 + uVar186;
  uVar182 = uVar58 ^ uVar182;
  uVar152 = uVar182 << 1;
  uVar186 = (ulong)((long)uVar182 < 0);
  uVar153 = (uVar135 & 0xffffffff | uVar136) * (uVar112 & 0xffffffff) * 2 + uVar112 + uVar189;
  uVar139 = uVar139 ^ uVar153;
  uVar135 = uVar139 >> 0x20;
  uVar183 = uVar139 << 0x20 | uVar135;
  uVar136 = uVar135 * (uVar156 & 0xffffffff) * 2 + uVar183 + uVar156;
  uVar189 = uVar189 ^ uVar136;
  uVar135 = uVar189 >> 0x18;
  uVar182 = uVar189 << 0x28 | uVar135;
  uVar119 = (uVar135 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar182 + uVar153;
  uVar183 = uVar119 ^ uVar183;
  uVar139 = uVar183 >> 0x10;
  uVar120 = uVar183 << 0x30 | uVar139;
  uVar59 = (uVar139 & 0xffffffff) * (uVar136 & 0xffffffff) * 2 + uVar120 + uVar136;
  uVar182 = uVar59 ^ uVar182;
  uVar135 = uVar182 << 1;
  uVar156 = (ulong)((long)uVar182 < 0);
  uVar182 = (local_830.v[100] & 0xffffffff) * (local_830.v[0x60] & 0xffffffff) * 2 +
            local_830.v[100] + local_830.v[0x60];
  uVar136 = (local_830.v[0x6c] ^ uVar182) >> 0x20;
  uVar153 = (local_830.v[0x6c] ^ uVar182) << 0x20 | uVar136;
  uVar183 = uVar136 * (local_830.v[0x68] & 0xffffffff) * 2 + uVar153 + local_830.v[0x68];
  uVar136 = (local_830.v[100] ^ uVar183) >> 0x18;
  uVar67 = (local_830.v[100] ^ uVar183) << 0x28 | uVar136;
  uVar146 = (uVar136 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar67 + uVar182;
  uVar153 = uVar153 ^ uVar146;
  uVar136 = uVar153 >> 0x10;
  uVar121 = uVar153 << 0x30 | uVar136;
  uVar153 = (local_830.v[0x65] & 0xffffffff) * (local_830.v[0x61] & 0xffffffff) * 2 +
            local_830.v[0x65] + local_830.v[0x61];
  uVar182 = (local_830.v[0x6d] ^ uVar153) >> 0x20;
  uVar128 = (local_830.v[0x6d] ^ uVar153) << 0x20 | uVar182;
  uVar158 = uVar182 * (local_830.v[0x69] & 0xffffffff) * 2 + uVar128 + local_830.v[0x69];
  uVar182 = (local_830.v[0x65] ^ uVar158) >> 0x18;
  uVar187 = (local_830.v[0x65] ^ uVar158) << 0x28 | uVar182;
  uVar66 = (uVar136 & 0xffffffff) * (uVar183 & 0xffffffff) * 2 + uVar121 + uVar183;
  uVar112 = (uVar182 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar187 + uVar153;
  uVar128 = uVar128 ^ uVar112;
  uVar136 = uVar128 >> 0x10;
  uVar148 = uVar128 << 0x30 | uVar136;
  uVar158 = (uVar136 & 0xffffffff) * (uVar158 & 0xffffffff) * 2 + uVar148 + uVar158;
  uVar182 = (local_830.v[0x66] & 0xffffffff) * (local_830.v[0x62] & 0xffffffff) * 2 +
            local_830.v[0x66] + local_830.v[0x62];
  uVar136 = (local_830.v[0x6e] ^ uVar182) >> 0x20;
  uVar183 = (local_830.v[0x6e] ^ uVar182) << 0x20 | uVar136;
  uVar153 = uVar136 * (local_830.v[0x6a] & 0xffffffff) * 2 + uVar183 + local_830.v[0x6a];
  uVar136 = (local_830.v[0x66] ^ uVar153) >> 0x18;
  uVar159 = (local_830.v[0x66] ^ uVar153) << 0x28 | uVar136;
  uVar176 = (uVar136 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar159 + uVar182;
  uVar183 = uVar183 ^ uVar176;
  uVar136 = uVar183 >> 0x10;
  uVar140 = uVar183 << 0x30 | uVar136;
  uVar170 = (local_830.v[0x67] & 0xffffffff) * (local_830.v[99] & 0xffffffff) * 2 +
            local_830.v[99] + local_830.v[0x67];
  uVar182 = (local_830.v[0x6f] ^ uVar170) >> 0x20;
  uVar189 = (local_830.v[0x6f] ^ uVar170) << 0x20 | uVar182;
  uVar129 = (uVar136 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar153 + uVar140;
  uVar183 = uVar182 * (local_830.v[0x6b] & 0xffffffff) * 2 + local_830.v[0x6b] + uVar189;
  uVar136 = (local_830.v[0x67] ^ uVar183) >> 0x18;
  uVar190 = (local_830.v[0x67] ^ uVar183) << 0x28 | uVar136;
  uVar170 = (uVar136 & 0xffffffff) * (uVar170 & 0xffffffff) * 2 + uVar190 + uVar170;
  uVar187 = uVar187 ^ uVar158;
  uVar136 = uVar187 << 1;
  uVar182 = (ulong)((long)uVar187 < 0);
  uVar128 = uVar136 | uVar182;
  uVar189 = uVar189 ^ uVar170;
  uVar153 = uVar189 >> 0x10;
  uVar189 = uVar189 << 0x30 | uVar153;
  uVar182 = (uVar136 & 0xffffffff | uVar182) * (uVar146 & 0xffffffff) * 2 + uVar146 + uVar128;
  uVar187 = uVar189 ^ uVar182;
  uVar136 = uVar187 >> 0x20;
  uVar146 = uVar187 << 0x20 | uVar136;
  uVar159 = uVar159 ^ uVar129;
  uVar187 = uVar136 * (uVar129 & 0xffffffff) * 2 + uVar129 + uVar146;
  uVar128 = uVar128 ^ uVar187;
  uVar136 = uVar128 >> 0x18;
  uVar129 = uVar128 << 0x28 | uVar136;
  uVar177 = (uVar136 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar182 + uVar129;
  uVar146 = uVar146 ^ uVar177;
  uVar136 = uVar146 >> 0x10;
  uVar69 = uVar146 << 0x30 | uVar136;
  uVar183 = (uVar153 & 0xffffffff) * (uVar183 & 0xffffffff) * 2 + uVar183 + uVar189;
  uVar189 = (uVar136 & 0xffffffff) * (uVar187 & 0xffffffff) * 2 + uVar187 + uVar69;
  uVar136 = uVar159 << 1;
  uVar182 = (ulong)((long)uVar159 < 0);
  uVar159 = uVar136 | uVar182;
  uVar112 = (uVar136 & 0xffffffff | uVar182) * (uVar112 & 0xffffffff) * 2 + uVar159 + uVar112;
  uVar121 = uVar121 ^ uVar112;
  uVar182 = uVar121 >> 0x20;
  uVar146 = uVar121 << 0x20 | uVar182;
  uVar129 = uVar189 ^ uVar129;
  uVar67 = uVar67 ^ uVar66;
  uVar136 = uVar67 << 1;
  uVar153 = (ulong)((long)uVar67 < 0);
  uVar67 = uVar136 | uVar153;
  uVar190 = uVar190 ^ uVar183;
  uVar128 = uVar182 * (uVar183 & 0xffffffff) * 2 + uVar183 + uVar146;
  uVar159 = uVar159 ^ uVar128;
  uVar187 = uVar159 >> 0x18;
  uVar160 = uVar159 << 0x28 | uVar187;
  uVar182 = uVar190 << 1;
  uVar183 = (ulong)((long)uVar190 < 0);
  uVar121 = uVar182 | uVar183;
  uVar112 = (uVar187 & 0xffffffff) * (uVar112 & 0xffffffff) * 2 + uVar160 + uVar112;
  uVar146 = uVar146 ^ uVar112;
  uVar187 = uVar146 >> 0x10;
  uVar122 = uVar146 << 0x30 | uVar187;
  uVar60 = (uVar187 & 0xffffffff) * (uVar128 & 0xffffffff) * 2 + uVar122 + uVar128;
  uVar160 = uVar60 ^ uVar160;
  uVar183 = (uVar182 & 0xffffffff | uVar183) * (uVar176 & 0xffffffff) * 2 + uVar121 + uVar176;
  uVar148 = uVar148 ^ uVar183;
  uVar182 = uVar148 >> 0x20;
  uVar187 = uVar148 << 0x20 | uVar182;
  uVar66 = uVar182 * (uVar66 & 0xffffffff) * 2 + uVar187 + uVar66;
  uVar121 = uVar121 ^ uVar66;
  uVar182 = uVar121 >> 0x18;
  uVar191 = uVar121 << 0x28 | uVar182;
  uVar176 = (uVar182 & 0xffffffff) * (uVar183 & 0xffffffff) * 2 + uVar191 + uVar183;
  uVar187 = uVar176 ^ uVar187;
  uVar182 = uVar187 >> 0x10;
  uVar123 = uVar187 << 0x30 | uVar182;
  uVar61 = (uVar182 & 0xffffffff) * (uVar66 & 0xffffffff) * 2 + uVar123 + uVar66;
  uVar191 = uVar61 ^ uVar191;
  uVar153 = (uVar136 & 0xffffffff | uVar153) * (uVar170 & 0xffffffff) * 2 + uVar170 + uVar67;
  uVar140 = uVar140 ^ uVar153;
  uVar136 = uVar140 >> 0x20;
  uVar183 = uVar140 << 0x20 | uVar136;
  uVar182 = uVar136 * (uVar158 & 0xffffffff) * 2 + uVar183 + uVar158;
  uVar67 = uVar67 ^ uVar182;
  uVar136 = uVar67 >> 0x18;
  uVar68 = uVar67 << 0x28 | uVar136;
  uVar170 = (uVar136 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar68 + uVar153;
  uVar183 = uVar170 ^ uVar183;
  uVar136 = uVar183 >> 0x10;
  uVar124 = uVar183 << 0x30 | uVar136;
  uVar62 = (uVar136 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar124 + uVar182;
  uVar68 = uVar62 ^ uVar68;
  uVar182 = (local_830.v[0x74] & 0xffffffff) * (local_830.v[0x70] & 0xffffffff) * 2 +
            local_830.v[0x74] + local_830.v[0x70];
  uVar136 = (local_830.v[0x7c] ^ uVar182) >> 0x20;
  uVar153 = (local_830.v[0x7c] ^ uVar182) << 0x20 | uVar136;
  uVar128 = uVar136 * (local_830.v[0x78] & 0xffffffff) * 2 + uVar153 + local_830.v[0x78];
  uVar136 = (local_830.v[0x74] ^ uVar128) >> 0x18;
  uVar159 = (local_830.v[0x74] ^ uVar128) << 0x28 | uVar136;
  uVar187 = (uVar136 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar159 + uVar182;
  uVar153 = uVar153 ^ uVar187;
  uVar136 = uVar153 >> 0x10;
  uVar158 = uVar153 << 0x30 | uVar136;
  uVar183 = (local_830.v[0x75] & 0xffffffff) * (local_830.v[0x71] & 0xffffffff) * 2 +
            local_830.v[0x75] + local_830.v[0x71];
  uVar182 = (local_830.v[0x7d] ^ uVar183) >> 0x20;
  uVar67 = (local_830.v[0x7d] ^ uVar183) << 0x20 | uVar182;
  uVar153 = uVar182 * (local_830.v[0x79] & 0xffffffff) * 2 + uVar67 + local_830.v[0x79];
  uVar182 = (local_830.v[0x75] ^ uVar153) >> 0x18;
  uVar146 = (local_830.v[0x75] ^ uVar153) << 0x28 | uVar182;
  uVar66 = (uVar182 & 0xffffffff) * (uVar183 & 0xffffffff) * 2 + uVar146 + uVar183;
  uVar67 = uVar67 ^ uVar66;
  uVar182 = uVar67 >> 0x10;
  uVar149 = uVar67 << 0x30 | uVar182;
  uVar148 = (uVar136 & 0xffffffff) * (uVar128 & 0xffffffff) * 2 + uVar158 + uVar128;
  uVar190 = (local_830.v[0x76] & 0xffffffff) * (local_830.v[0x72] & 0xffffffff) * 2 +
            local_830.v[0x72] + local_830.v[0x76];
  uVar136 = (local_830.v[0x7e] ^ uVar190) >> 0x20;
  uVar183 = (local_830.v[0x7e] ^ uVar190) << 0x20 | uVar136;
  uVar128 = uVar136 * (local_830.v[0x7a] & 0xffffffff) * 2 + local_830.v[0x7a] + uVar183;
  uVar136 = (local_830.v[0x76] ^ uVar128) >> 0x18;
  uVar140 = (local_830.v[0x76] ^ uVar128) << 0x28 | uVar136;
  uVar192 = (uVar182 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar153 + uVar149;
  uVar190 = (uVar136 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar140 + uVar190;
  uVar183 = uVar183 ^ uVar190;
  uVar136 = uVar183 >> 0x10;
  uVar161 = uVar183 << 0x30 | uVar136;
  uVar128 = (uVar136 & 0xffffffff) * (uVar128 & 0xffffffff) * 2 + uVar161 + uVar128;
  uVar153 = (local_830.v[0x77] & 0xffffffff) * (local_830.v[0x73] & 0xffffffff) * 2 +
            local_830.v[0x73] + local_830.v[0x77];
  uVar136 = (local_830.v[0x7f] ^ uVar153) >> 0x20;
  uVar182 = (local_830.v[0x7f] ^ uVar153) << 0x20 | uVar136;
  uVar67 = uVar136 * (local_830.v[0x7b] & 0xffffffff) * 2 + local_830.v[0x7b] + uVar182;
  uVar136 = (local_830.v[0x77] ^ uVar67) >> 0x18;
  uVar172 = (local_830.v[0x77] ^ uVar67) << 0x28 | uVar136;
  uVar193 = (uVar136 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar153 + uVar172;
  uVar182 = uVar182 ^ uVar193;
  uVar153 = uVar182 >> 0x10;
  uVar183 = uVar182 << 0x30 | uVar153;
  uVar146 = uVar146 ^ uVar192;
  uVar136 = uVar146 << 1;
  uVar182 = (ulong)((long)uVar146 < 0);
  uVar146 = uVar136 | uVar182;
  uVar187 = (uVar136 & 0xffffffff | uVar182) * (uVar187 & 0xffffffff) * 2 + uVar146 + uVar187;
  uVar182 = uVar183 ^ uVar187;
  uVar136 = uVar182 >> 0x20;
  uVar182 = uVar182 << 0x20 | uVar136;
  uVar183 = (uVar153 & 0xffffffff) * (uVar67 & 0xffffffff) * 2 + uVar67 + uVar183;
  uVar140 = uVar140 ^ uVar128;
  uVar153 = uVar136 * (uVar128 & 0xffffffff) * 2 + uVar128 + uVar182;
  uVar146 = uVar146 ^ uVar153;
  uVar136 = uVar146 >> 0x18;
  uVar121 = uVar146 << 0x28 | uVar136;
  uVar130 = (uVar136 & 0xffffffff) * (uVar187 & 0xffffffff) * 2 + uVar187 + uVar121;
  uVar182 = uVar182 ^ uVar130;
  uVar136 = uVar182 >> 0x10;
  uVar67 = uVar182 << 0x30 | uVar136;
  uVar146 = (uVar136 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar67 + uVar153;
  uVar121 = uVar146 ^ uVar121;
  uVar136 = uVar140 << 1;
  uVar182 = (ulong)((long)uVar140 < 0);
  uVar187 = uVar136 | uVar182;
  uVar66 = (uVar136 & 0xffffffff | uVar182) * (uVar66 & 0xffffffff) * 2 + uVar187 + uVar66;
  uVar158 = uVar158 ^ uVar66;
  uVar136 = uVar158 >> 0x20;
  uVar153 = uVar158 << 0x20 | uVar136;
  uVar172 = uVar172 ^ uVar183;
  uVar182 = uVar136 * (uVar183 & 0xffffffff) * 2 + uVar183 + uVar153;
  uVar187 = uVar187 ^ uVar182;
  uVar136 = uVar187 >> 0x18;
  uVar140 = uVar187 << 0x28 | uVar136;
  uVar66 = (uVar136 & 0xffffffff) * (uVar66 & 0xffffffff) * 2 + uVar140 + uVar66;
  uVar153 = uVar153 ^ uVar66;
  uVar136 = uVar153 >> 0x10;
  uVar141 = uVar153 << 0x30 | uVar136;
  uVar158 = (uVar136 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar141 + uVar182;
  uVar136 = uVar172 << 1;
  uVar182 = (ulong)((long)uVar172 < 0);
  uVar128 = uVar136 | uVar182;
  uVar190 = (uVar136 & 0xffffffff | uVar182) * (uVar190 & 0xffffffff) * 2 + uVar128 + uVar190;
  uVar159 = uVar159 ^ uVar148;
  uVar136 = uVar159 << 1;
  uVar182 = (ulong)((long)uVar159 < 0);
  uVar183 = uVar136 | uVar182;
  uVar149 = uVar149 ^ uVar190;
  uVar153 = uVar149 >> 0x20;
  uVar187 = uVar149 << 0x20 | uVar153;
  uVar140 = uVar158 ^ uVar140;
  uVar148 = uVar153 * (uVar148 & 0xffffffff) * 2 + uVar187 + uVar148;
  uVar128 = uVar128 ^ uVar148;
  uVar153 = uVar128 >> 0x18;
  uVar159 = uVar128 << 0x28 | uVar153;
  uVar190 = (uVar153 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar159 + uVar190;
  uVar187 = uVar190 ^ uVar187;
  uVar153 = uVar187 >> 0x10;
  uVar142 = uVar187 << 0x30 | uVar153;
  uVar148 = (uVar153 & 0xffffffff) * (uVar148 & 0xffffffff) * 2 + uVar142 + uVar148;
  uVar159 = uVar148 ^ uVar159;
  uVar153 = (uVar136 & 0xffffffff | uVar182) * (uVar193 & 0xffffffff) * 2 + uVar193 + uVar183;
  uVar161 = uVar161 ^ uVar153;
  uVar136 = uVar161 >> 0x20;
  uVar187 = uVar161 << 0x20 | uVar136;
  uVar182 = uVar136 * (uVar192 & 0xffffffff) * 2 + uVar187 + uVar192;
  uVar183 = uVar183 ^ uVar182;
  uVar136 = uVar183 >> 0x18;
  uVar172 = uVar183 << 0x28 | uVar136;
  uVar192 = (uVar136 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar172 + uVar153;
  uVar187 = uVar192 ^ uVar187;
  uVar136 = uVar187 >> 0x10;
  uVar149 = uVar187 << 0x30 | uVar136;
  uVar161 = (uVar136 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar149 + uVar182;
  uVar172 = uVar161 ^ uVar172;
  uVar193 = (uVar87 & 0xffffffff) * (uVar71 & 0xffffffff) * 2 + uVar87 + uVar71;
  uVar177 = uVar177 ^ uVar193;
  uVar136 = uVar177 >> 0x20;
  uVar153 = uVar177 << 0x20 | uVar136;
  uVar177 = uVar136 * (uVar104 & 0xffffffff) * 2 + uVar104 + uVar153;
  uVar136 = (uVar87 ^ uVar177) >> 0x18;
  uVar182 = (uVar87 ^ uVar177) << 0x28 | uVar136;
  uVar193 = (uVar136 & 0xffffffff) * (uVar193 & 0xffffffff) * 2 + uVar182 + uVar193;
  uVar153 = uVar153 ^ uVar193;
  uVar136 = uVar153 >> 0x10;
  uVar173 = uVar153 << 0x30 | uVar136;
  uVar177 = (uVar136 & 0xffffffff) * (uVar177 & 0xffffffff) * 2 + uVar173 + uVar177;
  uVar182 = uVar177 ^ uVar182;
  uVar136 = uVar182 << 1;
  uVar183 = (ulong)((long)uVar182 < 0);
  uVar87 = uVar136 | uVar183;
  uVar187 = (uVar89 & 0xffffffff) * (uVar73 & 0xffffffff) * 2 + uVar89 + uVar73;
  uVar112 = uVar112 ^ uVar187;
  uVar182 = uVar112 >> 0x20;
  uVar112 = uVar112 << 0x20 | uVar182;
  uVar73 = uVar182 * (uVar106 & 0xffffffff) * 2 + uVar112 + uVar106;
  uVar182 = (uVar89 ^ uVar73) >> 0x18;
  uVar153 = (uVar89 ^ uVar73) << 0x28 | uVar182;
  uVar128 = (uVar182 & 0xffffffff) * (uVar187 & 0xffffffff) * 2 + uVar153 + uVar187;
  uVar112 = uVar112 ^ uVar128;
  uVar182 = uVar112 >> 0x10;
  uVar71 = uVar112 << 0x30 | uVar182;
  uVar162 = (uVar182 & 0xffffffff) * (uVar73 & 0xffffffff) * 2 + uVar71 + uVar73;
  uVar153 = uVar162 ^ uVar153;
  uVar182 = uVar153 << 1;
  uVar153 = (ulong)((long)uVar153 < 0);
  uVar104 = uVar182 | uVar153;
  uVar79 = (uVar95 & 0xffffffff) * (uVar79 & 0xffffffff) * 2 + uVar95 + uVar79;
  uVar130 = uVar130 ^ uVar79;
  uVar187 = uVar130 >> 0x20;
  uVar89 = uVar130 << 0x20 | uVar187;
  uVar112 = uVar187 * (uVar113 & 0xffffffff) * 2 + uVar89 + uVar113;
  uVar187 = (uVar95 ^ uVar112) >> 0x18;
  uVar73 = (uVar95 ^ uVar112) << 0x28 | uVar187;
  uVar79 = (uVar187 & 0xffffffff) * (uVar79 & 0xffffffff) * 2 + uVar73 + uVar79;
  uVar89 = uVar89 ^ uVar79;
  uVar187 = uVar89 >> 0x10;
  uVar89 = uVar89 << 0x30 | uVar187;
  uVar112 = (uVar187 & 0xffffffff) * (uVar112 & 0xffffffff) * 2 + uVar89 + uVar112;
  uVar73 = uVar73 ^ uVar112;
  uVar95 = (uVar97 & 0xffffffff) * (uVar81 & 0xffffffff) * 2 + uVar97 + uVar81;
  uVar66 = uVar66 ^ uVar95;
  uVar187 = uVar66 >> 0x20;
  uVar81 = uVar66 << 0x20 | uVar187;
  uVar106 = uVar187 * (uVar115 & 0xffffffff) * 2 + uVar81 + uVar115;
  uVar187 = (uVar97 ^ uVar106) >> 0x18;
  uVar66 = (uVar97 ^ uVar106) << 0x28 | uVar187;
  uVar95 = (uVar187 & 0xffffffff) * (uVar95 & 0xffffffff) * 2 + uVar66 + uVar95;
  uVar81 = uVar81 ^ uVar95;
  uVar187 = uVar81 >> 0x10;
  uVar81 = uVar81 << 0x30 | uVar187;
  uVar106 = (uVar187 & 0xffffffff) * (uVar106 & 0xffffffff) * 2 + uVar81 + uVar106;
  uVar187 = (uVar182 & 0xffffffff | uVar153) * (uVar193 & 0xffffffff) * 2 + uVar104 + uVar193;
  uVar81 = uVar81 ^ uVar187;
  uVar182 = uVar81 >> 0x20;
  uVar153 = uVar81 << 0x20 | uVar182;
  uVar97 = uVar182 * (uVar112 & 0xffffffff) * 2 + uVar153 + uVar112;
  uVar104 = uVar104 ^ uVar97;
  uVar182 = uVar104 >> 0x18;
  uVar104 = uVar104 << 0x28 | uVar182;
  local_830.v[0] = (uVar182 & 0xffffffff) * (uVar187 & 0xffffffff) * 2 + uVar187 + uVar104;
  uVar66 = uVar66 ^ uVar106;
  uVar182 = uVar66 << 1;
  uVar187 = (ulong)((long)uVar66 < 0);
  uVar81 = uVar182 | uVar187;
  uVar153 = local_830.v[0] ^ uVar153;
  uVar112 = uVar153 >> 0x10;
  local_830.v[0x71] = uVar153 << 0x30 | uVar112;
  uVar153 = uVar73 << 1;
  uVar66 = (ulong)((long)uVar73 < 0);
  uVar73 = uVar153 | uVar66;
  local_830.v[0x50] =
       (uVar112 & 0xffffffff) * (uVar97 & 0xffffffff) * 2 + local_830.v[0x71] + uVar97;
  uVar104 = local_830.v[0x50] ^ uVar104;
  local_830.v[0x21] = uVar104 << 1 | (ulong)((long)uVar104 < 0);
  uVar128 = (uVar153 & 0xffffffff | uVar66) * (uVar128 & 0xffffffff) * 2 + uVar128 + uVar73;
  uVar173 = uVar173 ^ uVar128;
  uVar153 = uVar173 >> 0x20;
  uVar97 = uVar173 << 0x20 | uVar153;
  uVar66 = uVar153 * (uVar106 & 0xffffffff) * 2 + uVar106 + uVar97;
  uVar73 = uVar73 ^ uVar66;
  uVar153 = uVar73 >> 0x18;
  uVar112 = uVar73 << 0x28 | uVar153;
  local_830.v[1] = (uVar153 & 0xffffffff) * (uVar128 & 0xffffffff) * 2 + uVar112 + uVar128;
  uVar97 = local_830.v[1] ^ uVar97;
  uVar153 = uVar97 >> 0x10;
  local_830.v[0x60] = uVar97 << 0x30 | uVar153;
  local_830.v[0x51] =
       (uVar153 & 0xffffffff) * (uVar66 & 0xffffffff) * 2 + local_830.v[0x60] + uVar66;
  uVar112 = local_830.v[0x51] ^ uVar112;
  local_830.v[0x30] = uVar112 << 1 | (ulong)((long)uVar112 < 0);
  uVar79 = (uVar182 & 0xffffffff | uVar187) * (uVar79 & 0xffffffff) * 2 + uVar81 + uVar79;
  uVar71 = uVar71 ^ uVar79;
  uVar182 = uVar71 >> 0x20;
  uVar153 = uVar71 << 0x20 | uVar182;
  uVar66 = uVar182 * (uVar177 & 0xffffffff) * 2 + uVar153 + uVar177;
  uVar81 = uVar81 ^ uVar66;
  uVar182 = uVar81 >> 0x18;
  uVar187 = uVar81 << 0x28 | uVar182;
  local_830.v[0x10] = (uVar182 & 0xffffffff) * (uVar79 & 0xffffffff) * 2 + uVar187 + uVar79;
  uVar153 = local_830.v[0x10] ^ uVar153;
  uVar182 = uVar153 >> 0x10;
  local_830.v[0x61] = uVar153 << 0x30 | uVar182;
  local_830.v[0x40] =
       (uVar182 & 0xffffffff) * (uVar66 & 0xffffffff) * 2 + local_830.v[0x61] + uVar66;
  uVar187 = local_830.v[0x40] ^ uVar187;
  local_830.v[0x31] = uVar187 << 1 | (ulong)((long)uVar187 < 0);
  uVar95 = (uVar136 & 0xffffffff | uVar183) * (uVar95 & 0xffffffff) * 2 + uVar87 + uVar95;
  uVar89 = uVar89 ^ uVar95;
  uVar136 = uVar89 >> 0x20;
  uVar153 = uVar89 << 0x20 | uVar136;
  uVar183 = uVar136 * (uVar162 & 0xffffffff) * 2 + uVar153 + uVar162;
  uVar87 = uVar87 ^ uVar183;
  uVar136 = uVar87 >> 0x18;
  uVar182 = uVar87 << 0x28 | uVar136;
  local_830.v[0x11] = (uVar136 & 0xffffffff) * (uVar95 & 0xffffffff) * 2 + uVar182 + uVar95;
  uVar153 = local_830.v[0x11] ^ uVar153;
  uVar136 = uVar153 >> 0x10;
  local_830.v[0x70] = uVar153 << 0x30 | uVar136;
  local_830.v[0x41] =
       (uVar136 & 0xffffffff) * (uVar183 & 0xffffffff) * 2 + local_830.v[0x70] + uVar183;
  uVar182 = local_830.v[0x41] ^ uVar182;
  local_830.v[0x20] = uVar182 << 1 | (ulong)((long)uVar182 < 0);
  uVar183 = (uVar91 & 0xffffffff) * (uVar75 & 0xffffffff) * 2 + uVar91 + uVar75;
  uVar176 = uVar176 ^ uVar183;
  uVar136 = uVar176 >> 0x20;
  uVar153 = uVar176 << 0x20 | uVar136;
  uVar187 = uVar136 * (uVar108 & 0xffffffff) * 2 + uVar153 + uVar108;
  uVar136 = (uVar91 ^ uVar187) >> 0x18;
  uVar182 = (uVar91 ^ uVar187) << 0x28 | uVar136;
  uVar75 = (uVar136 & 0xffffffff) * (uVar183 & 0xffffffff) * 2 + uVar182 + uVar183;
  uVar153 = uVar75 ^ uVar153;
  uVar136 = uVar153 >> 0x10;
  uVar81 = uVar153 << 0x30 | uVar136;
  uVar95 = (uVar136 & 0xffffffff) * (uVar187 & 0xffffffff) * 2 + uVar81 + uVar187;
  uVar182 = uVar95 ^ uVar182;
  uVar136 = uVar182 << 1;
  uVar187 = (ulong)((long)uVar182 < 0);
  uVar73 = uVar136 | uVar187;
  uVar66 = (uVar93 & 0xffffffff) * (uVar77 & 0xffffffff) * 2 + uVar93 + uVar77;
  uVar170 = uVar170 ^ uVar66;
  uVar182 = uVar170 >> 0x20;
  uVar183 = uVar170 << 0x20 | uVar182;
  uVar112 = uVar182 * (uVar110 & 0xffffffff) * 2 + uVar183 + uVar110;
  uVar182 = (uVar93 ^ uVar112) >> 0x18;
  uVar153 = (uVar93 ^ uVar112) << 0x28 | uVar182;
  uVar77 = (uVar182 & 0xffffffff) * (uVar66 & 0xffffffff) * 2 + uVar153 + uVar66;
  uVar183 = uVar77 ^ uVar183;
  uVar182 = uVar183 >> 0x10;
  uVar87 = uVar183 << 0x30 | uVar182;
  uVar176 = (uVar182 & 0xffffffff) * (uVar112 & 0xffffffff) * 2 + uVar87 + uVar112;
  uVar153 = uVar176 ^ uVar153;
  uVar182 = uVar153 << 1;
  uVar66 = (ulong)((long)uVar153 < 0);
  uVar170 = uVar182 | uVar66;
  uVar128 = (uVar99 & 0xffffffff) * (uVar83 & 0xffffffff) * 2 + uVar99 + uVar83;
  uVar190 = uVar190 ^ uVar128;
  uVar153 = uVar190 >> 0x20;
  uVar112 = uVar190 << 0x20 | uVar153;
  uVar71 = uVar153 * (uVar117 & 0xffffffff) * 2 + uVar112 + uVar117;
  uVar153 = (uVar99 ^ uVar71) >> 0x18;
  uVar183 = (uVar99 ^ uVar71) << 0x28 | uVar153;
  uVar91 = (uVar153 & 0xffffffff) * (uVar128 & 0xffffffff) * 2 + uVar183 + uVar128;
  uVar112 = uVar91 ^ uVar112;
  uVar153 = uVar112 >> 0x10;
  uVar89 = uVar112 << 0x30 | uVar153;
  uVar190 = (uVar153 & 0xffffffff) * (uVar71 & 0xffffffff) * 2 + uVar89 + uVar71;
  uVar183 = uVar183 ^ uVar190;
  uVar153 = uVar183 << 1;
  uVar112 = (ulong)((long)uVar183 < 0);
  uVar71 = uVar153 | uVar112;
  uVar83 = (uVar101 & 0xffffffff) * (uVar85 & 0xffffffff) * 2 + uVar101 + uVar85;
  uVar192 = uVar192 ^ uVar83;
  uVar183 = uVar192 >> 0x20;
  uVar79 = uVar192 << 0x20 | uVar183;
  uVar97 = uVar183 * (uVar119 & 0xffffffff) * 2 + uVar79 + uVar119;
  uVar183 = (uVar101 ^ uVar97) >> 0x18;
  uVar128 = (uVar101 ^ uVar97) << 0x28 | uVar183;
  uVar83 = (uVar183 & 0xffffffff) * (uVar83 & 0xffffffff) * 2 + uVar128 + uVar83;
  uVar79 = uVar83 ^ uVar79;
  uVar183 = uVar79 >> 0x10;
  uVar85 = uVar79 << 0x30 | uVar183;
  uVar97 = (uVar183 & 0xffffffff) * (uVar97 & 0xffffffff) * 2 + uVar85 + uVar97;
  uVar128 = uVar128 ^ uVar97;
  uVar183 = uVar128 << 1;
  uVar128 = (ulong)((long)uVar128 < 0);
  uVar79 = uVar183 | uVar128;
  uVar93 = (uVar182 & 0xffffffff | uVar66) * (uVar75 & 0xffffffff) * 2 + uVar170 + uVar75;
  uVar85 = uVar85 ^ uVar93;
  uVar182 = uVar85 >> 0x20;
  uVar75 = uVar85 << 0x20 | uVar182;
  uVar190 = uVar182 * (uVar190 & 0xffffffff) * 2 + uVar75 + uVar190;
  uVar170 = uVar170 ^ uVar190;
  uVar182 = uVar170 >> 0x18;
  uVar66 = uVar170 << 0x28 | uVar182;
  local_830.v[2] = (uVar182 & 0xffffffff) * (uVar93 & 0xffffffff) * 2 + uVar66 + uVar93;
  uVar75 = local_830.v[2] ^ uVar75;
  uVar182 = uVar75 >> 0x10;
  local_830.v[0x73] = uVar75 << 0x30 | uVar182;
  local_830.v[0x52] =
       (uVar182 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + local_830.v[0x73] + uVar190;
  uVar66 = local_830.v[0x52] ^ uVar66;
  local_830.v[0x23] = uVar66 << 1 | (ulong)((long)uVar66 < 0);
  uVar170 = (uVar153 & 0xffffffff | uVar112) * (uVar77 & 0xffffffff) * 2 + uVar71 + uVar77;
  uVar81 = uVar81 ^ uVar170;
  uVar182 = uVar81 >> 0x20;
  uVar66 = uVar81 << 0x20 | uVar182;
  uVar112 = uVar182 * (uVar97 & 0xffffffff) * 2 + uVar66 + uVar97;
  uVar71 = uVar71 ^ uVar112;
  uVar182 = uVar71 >> 0x18;
  uVar153 = uVar71 << 0x28 | uVar182;
  local_830.v[3] = (uVar182 & 0xffffffff) * (uVar170 & 0xffffffff) * 2 + uVar153 + uVar170;
  uVar66 = local_830.v[3] ^ uVar66;
  uVar182 = uVar66 >> 0x10;
  local_830.v[0x62] = uVar66 << 0x30 | uVar182;
  local_830.v[0x53] =
       (uVar182 & 0xffffffff) * (uVar112 & 0xffffffff) * 2 + local_830.v[0x62] + uVar112;
  uVar153 = local_830.v[0x53] ^ uVar153;
  local_830.v[0x32] = uVar153 << 1 | (ulong)((long)uVar153 < 0);
  uVar66 = (uVar183 & 0xffffffff | uVar128) * (uVar91 & 0xffffffff) * 2 + uVar79 + uVar91;
  uVar87 = uVar87 ^ uVar66;
  uVar182 = uVar87 >> 0x20;
  uVar153 = uVar87 << 0x20 | uVar182;
  uVar112 = uVar182 * (uVar95 & 0xffffffff) * 2 + uVar153 + uVar95;
  uVar79 = uVar79 ^ uVar112;
  uVar182 = uVar79 >> 0x18;
  uVar183 = uVar79 << 0x28 | uVar182;
  local_830.v[0x12] = (uVar182 & 0xffffffff) * (uVar66 & 0xffffffff) * 2 + uVar183 + uVar66;
  uVar153 = local_830.v[0x12] ^ uVar153;
  uVar182 = uVar153 >> 0x10;
  local_830.v[99] = uVar153 << 0x30 | uVar182;
  local_830.v[0x42] =
       (uVar182 & 0xffffffff) * (uVar112 & 0xffffffff) * 2 + local_830.v[99] + uVar112;
  uVar183 = local_830.v[0x42] ^ uVar183;
  local_830.v[0x33] = uVar183 << 1 | (ulong)((long)uVar183 < 0);
  uVar183 = (uVar136 & 0xffffffff | uVar187) * (uVar83 & 0xffffffff) * 2 + uVar73 + uVar83;
  uVar89 = uVar89 ^ uVar183;
  uVar136 = uVar89 >> 0x20;
  uVar153 = uVar89 << 0x20 | uVar136;
  uVar187 = uVar136 * (uVar176 & 0xffffffff) * 2 + uVar153 + uVar176;
  uVar73 = uVar73 ^ uVar187;
  uVar136 = uVar73 >> 0x18;
  uVar182 = uVar73 << 0x28 | uVar136;
  local_830.v[0x13] = (uVar136 & 0xffffffff) * (uVar183 & 0xffffffff) * 2 + uVar182 + uVar183;
  uVar153 = local_830.v[0x13] ^ uVar153;
  uVar136 = uVar153 >> 0x10;
  local_830.v[0x72] = uVar153 << 0x30 | uVar136;
  local_830.v[0x43] =
       (uVar136 & 0xffffffff) * (uVar187 & 0xffffffff) * 2 + local_830.v[0x72] + uVar187;
  uVar182 = local_830.v[0x43] ^ uVar182;
  local_830.v[0x22] = uVar182 << 1 | (ulong)((long)uVar182 < 0);
  uVar182 = (uVar132 & 0xffffffff | uVar125) * (uVar7 & 0xffffffff | uVar143) * 2 +
            uVar46 + (uVar7 | uVar143);
  uVar132 = (uVar68 << 1 | (ulong)((long)uVar68 < 0)) ^ uVar182;
  uVar7 = uVar132 >> 0x20;
  uVar136 = uVar132 << 0x20 | uVar7;
  uVar178 = uVar7 * (uVar178 & 0xffffffff | uVar103) * 2 + uVar136 + (uVar178 | uVar103);
  uVar46 = uVar46 ^ uVar178;
  uVar7 = uVar46 >> 0x18;
  uVar132 = uVar46 << 0x28 | uVar7;
  uVar103 = (uVar7 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar132 + uVar182;
  uVar136 = uVar103 ^ uVar136;
  uVar7 = uVar136 >> 0x10;
  uVar143 = uVar136 << 0x30 | uVar7;
  uVar125 = (uVar7 & 0xffffffff) * (uVar178 & 0xffffffff) * 2 + uVar143 + uVar178;
  uVar132 = uVar125 ^ uVar132;
  uVar7 = uVar132 << 1;
  uVar132 = (ulong)((long)uVar132 < 0);
  uVar136 = uVar7 | uVar132;
  uVar182 = (uVar34 & 0xffffffff | uVar144) * (uVar164 & 0xffffffff | uVar126) * 2 +
            uVar31 + (uVar164 | uVar126);
  uVar34 = (uVar129 << 1 | (ulong)((long)uVar129 < 0)) ^ uVar182;
  uVar164 = uVar34 >> 0x20;
  uVar178 = uVar34 << 0x20 | uVar164;
  uVar153 = uVar164 * (uVar179 & 0xffffffff | uVar185) * 2 + uVar178 + (uVar179 | uVar185);
  uVar31 = uVar31 ^ uVar153;
  uVar164 = uVar31 >> 0x18;
  uVar34 = uVar31 << 0x28 | uVar164;
  uVar144 = (uVar164 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar34 + uVar182;
  uVar178 = uVar144 ^ uVar178;
  uVar164 = uVar178 >> 0x10;
  uVar179 = uVar178 << 0x30 | uVar164;
  uVar153 = (uVar164 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar179 + uVar153;
  uVar34 = uVar153 ^ uVar34;
  uVar164 = uVar34 << 1;
  uVar34 = (ulong)((long)uVar34 < 0);
  uVar183 = uVar164 | uVar34;
  uVar182 = (uVar33 & 0xffffffff | uVar137) * (uVar131 & 0xffffffff | uVar145) * 2 +
            uVar52 + (uVar131 | uVar145);
  uVar33 = (uVar172 << 1 | (ulong)((long)uVar172 < 0)) ^ uVar182;
  uVar131 = uVar33 >> 0x20;
  uVar178 = uVar33 << 0x20 | uVar131;
  uVar135 = uVar131 * (uVar135 & 0xffffffff | uVar156) * 2 + uVar178 + (uVar135 | uVar156);
  uVar52 = uVar52 ^ uVar135;
  uVar131 = uVar52 >> 0x18;
  uVar33 = uVar52 << 0x28 | uVar131;
  uVar137 = (uVar131 & 0xffffffff) * (uVar182 & 0xffffffff) * 2 + uVar33 + uVar182;
  uVar178 = uVar137 ^ uVar178;
  uVar131 = uVar178 >> 0x10;
  uVar182 = uVar178 << 0x30 | uVar131;
  uVar126 = (uVar131 & 0xffffffff) * (uVar135 & 0xffffffff) * 2 + uVar182 + uVar135;
  uVar33 = uVar33 ^ uVar126;
  uVar131 = uVar33 << 1;
  uVar33 = (ulong)((long)uVar33 < 0);
  uVar178 = uVar131 | uVar33;
  uVar145 = (uVar134 & 0xffffffff | uVar154) * (uVar29 & 0xffffffff | uVar163) * 2 +
            uVar32 + (uVar29 | uVar163);
  uVar134 = (uVar121 << 1 | (ulong)((long)uVar121 < 0)) ^ uVar145;
  uVar29 = uVar134 >> 0x20;
  uVar135 = uVar134 << 0x20 | uVar29;
  uVar163 = uVar29 * (uVar181 & 0xffffffff | uVar127) * 2 + uVar135 + (uVar181 | uVar127);
  uVar32 = uVar32 ^ uVar163;
  uVar29 = uVar32 >> 0x18;
  uVar134 = uVar32 << 0x28 | uVar29;
  uVar145 = (uVar29 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar134 + uVar145;
  uVar135 = uVar145 ^ uVar135;
  uVar29 = uVar135 >> 0x10;
  uVar181 = uVar135 << 0x30 | uVar29;
  uVar163 = (uVar29 & 0xffffffff) * (uVar163 & 0xffffffff) * 2 + uVar181 + uVar163;
  uVar134 = uVar134 ^ uVar163;
  uVar29 = uVar134 << 1;
  uVar134 = (ulong)((long)uVar134 < 0);
  uVar135 = uVar29 | uVar134;
  uVar185 = (uVar164 & 0xffffffff | uVar34) * (uVar103 & 0xffffffff) * 2 + uVar183 + uVar103;
  uVar181 = uVar181 ^ uVar185;
  uVar164 = uVar181 >> 0x20;
  uVar154 = uVar181 << 0x20 | uVar164;
  uVar181 = uVar164 * (uVar126 & 0xffffffff) * 2 + uVar154 + uVar126;
  uVar183 = uVar183 ^ uVar181;
  uVar164 = uVar183 >> 0x18;
  uVar34 = uVar183 << 0x28 | uVar164;
  local_830.v[4] = (uVar164 & 0xffffffff) * (uVar185 & 0xffffffff) * 2 + uVar34 + uVar185;
  uVar154 = local_830.v[4] ^ uVar154;
  uVar164 = uVar154 >> 0x10;
  local_830.v[0x75] = uVar154 << 0x30 | uVar164;
  local_830.v[0x54] =
       (uVar164 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + local_830.v[0x75] + uVar181;
  uVar34 = local_830.v[0x54] ^ uVar34;
  local_830.v[0x25] = uVar34 << 1 | (ulong)((long)uVar34 < 0);
  uVar181 = (uVar131 & 0xffffffff | uVar33) * (uVar144 & 0xffffffff) * 2 + uVar178 + uVar144;
  uVar143 = uVar143 ^ uVar181;
  uVar164 = uVar143 >> 0x20;
  uVar34 = uVar143 << 0x20 | uVar164;
  uVar33 = uVar164 * (uVar163 & 0xffffffff) * 2 + uVar34 + uVar163;
  uVar178 = uVar178 ^ uVar33;
  uVar164 = uVar178 >> 0x18;
  uVar131 = uVar178 << 0x28 | uVar164;
  local_830.v[5] = (uVar164 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar131 + uVar181;
  uVar34 = local_830.v[5] ^ uVar34;
  uVar164 = uVar34 >> 0x10;
  local_830.v[100] = uVar34 << 0x30 | uVar164;
  local_830.v[0x55] = (uVar164 & 0xffffffff) * (uVar33 & 0xffffffff) * 2 + local_830.v[100] + uVar33
  ;
  uVar131 = local_830.v[0x55] ^ uVar131;
  local_830.v[0x34] = uVar131 << 1 | (ulong)((long)uVar131 < 0);
  uVar34 = (uVar29 & 0xffffffff | uVar134) * (uVar137 & 0xffffffff) * 2 + uVar135 + uVar137;
  uVar179 = uVar179 ^ uVar34;
  uVar164 = uVar179 >> 0x20;
  uVar131 = uVar179 << 0x20 | uVar164;
  uVar33 = uVar164 * (uVar125 & 0xffffffff) * 2 + uVar131 + uVar125;
  uVar135 = uVar135 ^ uVar33;
  uVar164 = uVar135 >> 0x18;
  uVar29 = uVar135 << 0x28 | uVar164;
  local_830.v[0x14] = (uVar164 & 0xffffffff) * (uVar34 & 0xffffffff) * 2 + uVar29 + uVar34;
  uVar131 = local_830.v[0x14] ^ uVar131;
  uVar164 = uVar131 >> 0x10;
  local_830.v[0x65] = uVar131 << 0x30 | uVar164;
  local_830.v[0x44] =
       (uVar164 & 0xffffffff) * (uVar33 & 0xffffffff) * 2 + local_830.v[0x65] + uVar33;
  uVar29 = local_830.v[0x44] ^ uVar29;
  local_830.v[0x35] = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  uVar29 = (uVar7 & 0xffffffff | uVar132) * (uVar145 & 0xffffffff) * 2 + uVar136 + uVar145;
  uVar182 = uVar182 ^ uVar29;
  uVar7 = uVar182 >> 0x20;
  uVar131 = uVar182 << 0x20 | uVar7;
  uVar132 = uVar7 * (uVar153 & 0xffffffff) * 2 + uVar131 + uVar153;
  uVar136 = uVar136 ^ uVar132;
  uVar7 = uVar136 >> 0x18;
  uVar164 = uVar136 << 0x28 | uVar7;
  local_830.v[0x15] = (uVar7 & 0xffffffff) * (uVar29 & 0xffffffff) * 2 + uVar164 + uVar29;
  uVar131 = local_830.v[0x15] ^ uVar131;
  uVar7 = uVar131 >> 0x10;
  local_830.v[0x74] = uVar131 << 0x30 | uVar7;
  local_830.v[0x45] =
       (uVar7 & 0xffffffff) * (uVar132 & 0xffffffff) * 2 + local_830.v[0x74] + uVar132;
  uVar164 = local_830.v[0x45] ^ uVar164;
  local_830.v[0x24] = uVar164 << 1 | (ulong)((long)uVar164 < 0);
  uVar131 = (uVar147 & 0xffffffff | uVar5) * (uVar30 & 0xffffffff | uVar1) * 2 +
            uVar42 + (uVar30 | uVar1);
  uVar30 = (uVar160 << 1 | (ulong)((long)uVar160 < 0)) ^ uVar131;
  uVar7 = uVar30 >> 0x20;
  uVar164 = uVar30 << 0x20 | uVar7;
  uVar29 = uVar7 * (uVar151 & 0xffffffff | uVar53) * 2 + uVar164 + (uVar151 | uVar53);
  uVar42 = uVar42 ^ uVar29;
  uVar7 = uVar42 >> 0x18;
  uVar30 = uVar42 << 0x28 | uVar7;
  uVar135 = (uVar7 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + uVar30 + uVar131;
  uVar164 = uVar135 ^ uVar164;
  uVar7 = uVar164 >> 0x10;
  uVar151 = uVar164 << 0x30 | uVar7;
  uVar179 = (uVar7 & 0xffffffff) * (uVar29 & 0xffffffff) * 2 + uVar151 + uVar29;
  uVar30 = uVar179 ^ uVar30;
  uVar7 = uVar30 << 1;
  uVar131 = (ulong)((long)uVar30 < 0);
  uVar34 = uVar7 | uVar131;
  uVar29 = (uVar133 & 0xffffffff | uVar6) * (uVar63 & 0xffffffff | uVar2) * 2 +
           uVar44 + (uVar63 | uVar2);
  uVar63 = (uVar191 << 1 | (ulong)((long)uVar191 < 0)) ^ uVar29;
  uVar30 = uVar63 >> 0x20;
  uVar164 = uVar63 << 0x20 | uVar30;
  uVar132 = uVar30 * (uVar175 & 0xffffffff | uVar65) * 2 + uVar164 + (uVar175 | uVar65);
  uVar44 = uVar44 ^ uVar132;
  uVar30 = uVar44 >> 0x18;
  uVar63 = uVar44 << 0x28 | uVar30;
  uVar175 = (uVar30 & 0xffffffff) * (uVar29 & 0xffffffff) * 2 + uVar63 + uVar29;
  uVar164 = uVar175 ^ uVar164;
  uVar30 = uVar164 >> 0x10;
  uVar147 = uVar164 << 0x30 | uVar30;
  uVar134 = (uVar30 & 0xffffffff) * (uVar132 & 0xffffffff) * 2 + uVar147 + uVar132;
  uVar63 = uVar134 ^ uVar63;
  uVar30 = uVar63 << 1;
  uVar29 = (ulong)((long)uVar63 < 0);
  uVar178 = uVar30 | uVar29;
  uVar132 = (uVar64 & 0xffffffff | uVar184) * (uVar174 & 0xffffffff | uVar3) * 2 +
            uVar48 + (uVar174 | uVar3);
  uVar164 = (uVar140 << 1 | (ulong)((long)uVar140 < 0)) ^ uVar132;
  uVar63 = uVar164 >> 0x20;
  uVar174 = uVar164 << 0x20 | uVar63;
  uVar133 = uVar63 * (uVar180 & 0xffffffff | uVar138) * 2 + uVar174 + (uVar180 | uVar138);
  uVar48 = uVar48 ^ uVar133;
  uVar63 = uVar48 >> 0x18;
  uVar164 = uVar48 << 0x28 | uVar63;
  uVar181 = (uVar63 & 0xffffffff) * (uVar132 & 0xffffffff) * 2 + uVar164 + uVar132;
  uVar174 = uVar181 ^ uVar174;
  uVar63 = uVar174 >> 0x10;
  uVar33 = uVar174 << 0x30 | uVar63;
  uVar64 = (uVar63 & 0xffffffff) * (uVar133 & 0xffffffff) * 2 + uVar33 + uVar133;
  uVar164 = uVar164 ^ uVar64;
  uVar63 = uVar164 << 1;
  uVar174 = (ulong)((long)uVar164 < 0);
  uVar132 = uVar63 | uVar174;
  uVar180 = (uVar70 & 0xffffffff | uVar155) * (uVar150 & 0xffffffff | uVar4) * 2 +
            uVar50 + (uVar150 | uVar4);
  uVar150 = (uVar159 << 1 | (ulong)((long)uVar159 < 0)) ^ uVar180;
  uVar164 = uVar150 >> 0x20;
  uVar133 = uVar150 << 0x20 | uVar164;
  uVar70 = uVar164 * (uVar152 & 0xffffffff | uVar186) * 2 + uVar133 + (uVar152 | uVar186);
  uVar50 = uVar50 ^ uVar70;
  uVar164 = uVar50 >> 0x18;
  uVar150 = uVar50 << 0x28 | uVar164;
  uVar180 = (uVar164 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar150 + uVar180;
  uVar133 = uVar180 ^ uVar133;
  uVar164 = uVar133 >> 0x10;
  uVar152 = uVar133 << 0x30 | uVar164;
  uVar70 = (uVar164 & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar152 + uVar70;
  uVar150 = uVar150 ^ uVar70;
  uVar164 = uVar150 << 1;
  uVar150 = (ulong)((long)uVar150 < 0);
  uVar133 = uVar164 | uVar150;
  uVar136 = (uVar30 & 0xffffffff | uVar29) * (uVar135 & 0xffffffff) * 2 + uVar178 + uVar135;
  uVar152 = uVar152 ^ uVar136;
  uVar30 = uVar152 >> 0x20;
  uVar135 = uVar152 << 0x20 | uVar30;
  uVar64 = uVar30 * (uVar64 & 0xffffffff) * 2 + uVar135 + uVar64;
  uVar178 = uVar178 ^ uVar64;
  uVar30 = uVar178 >> 0x18;
  uVar29 = uVar178 << 0x28 | uVar30;
  local_830.v[6] = (uVar30 & 0xffffffff) * (uVar136 & 0xffffffff) * 2 + uVar29 + uVar136;
  uVar135 = local_830.v[6] ^ uVar135;
  uVar30 = uVar135 >> 0x10;
  local_830.v[0x77] = uVar135 << 0x30 | uVar30;
  local_830.v[0x56] = (uVar30 & 0xffffffff) * (uVar64 & 0xffffffff) * 2 + local_830.v[0x77] + uVar64
  ;
  uVar29 = local_830.v[0x56] ^ uVar29;
  local_830.v[0x27] = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  uVar64 = (uVar63 & 0xffffffff | uVar174) * (uVar175 & 0xffffffff) * 2 + uVar132 + uVar175;
  uVar151 = uVar151 ^ uVar64;
  uVar30 = uVar151 >> 0x20;
  uVar174 = uVar151 << 0x20 | uVar30;
  uVar29 = uVar30 * (uVar70 & 0xffffffff) * 2 + uVar174 + uVar70;
  uVar132 = uVar132 ^ uVar29;
  uVar30 = uVar132 >> 0x18;
  uVar63 = uVar132 << 0x28 | uVar30;
  local_830.v[7] = (uVar30 & 0xffffffff) * (uVar64 & 0xffffffff) * 2 + uVar63 + uVar64;
  uVar174 = local_830.v[7] ^ uVar174;
  uVar30 = uVar174 >> 0x10;
  local_830.v[0x66] = uVar174 << 0x30 | uVar30;
  local_830.v[0x57] = (uVar30 & 0xffffffff) * (uVar29 & 0xffffffff) * 2 + local_830.v[0x66] + uVar29
  ;
  uVar63 = local_830.v[0x57] ^ uVar63;
  local_830.v[0x36] = uVar63 << 1 | (ulong)((long)uVar63 < 0);
  uVar174 = (uVar164 & 0xffffffff | uVar150) * (uVar181 & 0xffffffff) * 2 + uVar133 + uVar181;
  uVar147 = uVar147 ^ uVar174;
  uVar30 = uVar147 >> 0x20;
  uVar63 = uVar147 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar179 & 0xffffffff) * 2 + uVar63 + uVar179;
  uVar133 = uVar133 ^ uVar150;
  uVar30 = uVar133 >> 0x18;
  uVar164 = uVar133 << 0x28 | uVar30;
  local_830.v[0x16] = (uVar30 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar164 + uVar174;
  uVar63 = local_830.v[0x16] ^ uVar63;
  uVar30 = uVar63 >> 0x10;
  local_830.v[0x67] = uVar63 << 0x30 | uVar30;
  local_830.v[0x46] =
       (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + local_830.v[0x67] + uVar150;
  uVar164 = local_830.v[0x46] ^ uVar164;
  local_830.v[0x37] = uVar164 << 1 | (ulong)((long)uVar164 < 0);
  uVar164 = (uVar7 & 0xffffffff | uVar131) * (uVar180 & 0xffffffff) * 2 + uVar34 + uVar180;
  uVar33 = uVar33 ^ uVar164;
  uVar7 = uVar33 >> 0x20;
  uVar63 = uVar33 << 0x20 | uVar7;
  uVar131 = uVar7 * (uVar134 & 0xffffffff) * 2 + uVar63 + uVar134;
  uVar34 = uVar34 ^ uVar131;
  uVar7 = uVar34 >> 0x18;
  uVar30 = uVar34 << 0x28 | uVar7;
  local_830.v[0x17] = (uVar7 & 0xffffffff) * (uVar164 & 0xffffffff) * 2 + uVar30 + uVar164;
  uVar63 = local_830.v[0x17] ^ uVar63;
  uVar7 = uVar63 >> 0x10;
  local_830.v[0x76] = uVar63 << 0x30 | uVar7;
  local_830.v[0x47] =
       (uVar7 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + local_830.v[0x76] + uVar131;
  uVar30 = local_830.v[0x47] ^ uVar30;
  local_830.v[0x26] = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar164 = (uVar43 & 0xffffffff) * (uVar36 & 0xffffffff) * 2 + uVar43 + uVar36;
  uVar61 = uVar61 ^ uVar164;
  uVar7 = uVar61 >> 0x20;
  uVar63 = uVar61 << 0x20 | uVar7;
  uVar131 = uVar7 * (uVar55 & 0xffffffff) * 2 + uVar63 + uVar55;
  uVar7 = (uVar43 ^ uVar131) >> 0x18;
  uVar30 = (uVar43 ^ uVar131) << 0x28 | uVar7;
  uVar179 = (uVar7 & 0xffffffff) * (uVar164 & 0xffffffff) * 2 + uVar30 + uVar164;
  uVar63 = uVar179 ^ uVar63;
  uVar7 = uVar63 >> 0x10;
  uVar134 = uVar63 << 0x30 | uVar7;
  uVar178 = (uVar7 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + uVar134 + uVar131;
  uVar30 = uVar178 ^ uVar30;
  uVar7 = uVar30 << 1;
  uVar131 = (ulong)((long)uVar30 < 0);
  uVar133 = uVar7 | uVar131;
  uVar174 = (uVar45 & 0xffffffff) * (uVar37 & 0xffffffff) * 2 + uVar45 + uVar37;
  uVar62 = uVar62 ^ uVar174;
  uVar30 = uVar62 >> 0x20;
  uVar164 = uVar62 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar56 & 0xffffffff) * 2 + uVar164 + uVar56;
  uVar30 = (uVar45 ^ uVar150) >> 0x18;
  uVar63 = (uVar45 ^ uVar150) << 0x28 | uVar30;
  uVar135 = (uVar30 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar63 + uVar174;
  uVar164 = uVar135 ^ uVar164;
  uVar30 = uVar164 >> 0x10;
  uVar147 = uVar164 << 0x30 | uVar30;
  uVar64 = (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + uVar147 + uVar150;
  uVar63 = uVar64 ^ uVar63;
  uVar30 = uVar63 << 1;
  uVar174 = (ulong)((long)uVar63 < 0);
  uVar70 = uVar30 | uVar174;
  uVar29 = (uVar49 & 0xffffffff) * (uVar39 & 0xffffffff) * 2 + uVar49 + uVar39;
  uVar148 = uVar148 ^ uVar29;
  uVar63 = uVar148 >> 0x20;
  uVar150 = uVar148 << 0x20 | uVar63;
  uVar132 = uVar63 * (uVar58 & 0xffffffff) * 2 + uVar150 + uVar58;
  uVar63 = (uVar49 ^ uVar132) >> 0x18;
  uVar164 = (uVar49 ^ uVar132) << 0x28 | uVar63;
  uVar181 = (uVar63 & 0xffffffff) * (uVar29 & 0xffffffff) * 2 + uVar164 + uVar29;
  uVar150 = uVar181 ^ uVar150;
  uVar63 = uVar150 >> 0x10;
  uVar33 = uVar150 << 0x30 | uVar63;
  uVar151 = (uVar63 & 0xffffffff) * (uVar132 & 0xffffffff) * 2 + uVar33 + uVar132;
  uVar164 = uVar164 ^ uVar151;
  uVar63 = uVar164 << 1;
  uVar150 = (ulong)((long)uVar164 < 0);
  uVar132 = uVar63 | uVar150;
  uVar180 = (uVar51 & 0xffffffff) * (uVar40 & 0xffffffff) * 2 + uVar51 + uVar40;
  uVar161 = uVar161 ^ uVar180;
  uVar164 = uVar161 >> 0x20;
  uVar34 = uVar161 << 0x20 | uVar164;
  uVar175 = uVar164 * (uVar59 & 0xffffffff) * 2 + uVar34 + uVar59;
  uVar164 = (uVar51 ^ uVar175) >> 0x18;
  uVar29 = (uVar51 ^ uVar175) << 0x28 | uVar164;
  uVar180 = (uVar164 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar29 + uVar180;
  uVar34 = uVar180 ^ uVar34;
  uVar164 = uVar34 >> 0x10;
  uVar152 = uVar34 << 0x30 | uVar164;
  uVar175 = (uVar164 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar152 + uVar175;
  uVar29 = uVar29 ^ uVar175;
  uVar164 = uVar29 << 1;
  uVar29 = (ulong)((long)uVar29 < 0);
  uVar34 = uVar164 | uVar29;
  uVar136 = (uVar30 & 0xffffffff | uVar174) * (uVar179 & 0xffffffff) * 2 + uVar70 + uVar179;
  uVar152 = uVar152 ^ uVar136;
  uVar30 = uVar152 >> 0x20;
  uVar179 = uVar152 << 0x20 | uVar30;
  uVar151 = uVar30 * (uVar151 & 0xffffffff) * 2 + uVar179 + uVar151;
  uVar70 = uVar70 ^ uVar151;
  uVar30 = uVar70 >> 0x18;
  uVar174 = uVar70 << 0x28 | uVar30;
  local_830.v[8] = (uVar30 & 0xffffffff) * (uVar136 & 0xffffffff) * 2 + uVar174 + uVar136;
  uVar179 = local_830.v[8] ^ uVar179;
  uVar30 = uVar179 >> 0x10;
  local_830.v[0x79] = uVar179 << 0x30 | uVar30;
  local_830.v[0x58] =
       (uVar30 & 0xffffffff) * (uVar151 & 0xffffffff) * 2 + local_830.v[0x79] + uVar151;
  uVar174 = local_830.v[0x58] ^ uVar174;
  local_830.v[0x29] = uVar174 << 1 | (ulong)((long)uVar174 < 0);
  uVar70 = (uVar63 & 0xffffffff | uVar150) * (uVar135 & 0xffffffff) * 2 + uVar132 + uVar135;
  uVar134 = uVar134 ^ uVar70;
  uVar30 = uVar134 >> 0x20;
  uVar174 = uVar134 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar175 & 0xffffffff) * 2 + uVar174 + uVar175;
  uVar132 = uVar132 ^ uVar150;
  uVar30 = uVar132 >> 0x18;
  uVar63 = uVar132 << 0x28 | uVar30;
  local_830.v[9] = (uVar30 & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar63 + uVar70;
  uVar174 = local_830.v[9] ^ uVar174;
  uVar30 = uVar174 >> 0x10;
  local_830.v[0x68] = uVar174 << 0x30 | uVar30;
  local_830.v[0x59] =
       (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + local_830.v[0x68] + uVar150;
  uVar63 = local_830.v[0x59] ^ uVar63;
  local_830.v[0x38] = uVar63 << 1 | (ulong)((long)uVar63 < 0);
  uVar174 = (uVar164 & 0xffffffff | uVar29) * (uVar181 & 0xffffffff) * 2 + uVar34 + uVar181;
  uVar147 = uVar147 ^ uVar174;
  uVar30 = uVar147 >> 0x20;
  uVar63 = uVar147 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar178 & 0xffffffff) * 2 + uVar63 + uVar178;
  uVar34 = uVar34 ^ uVar150;
  uVar30 = uVar34 >> 0x18;
  uVar164 = uVar34 << 0x28 | uVar30;
  local_830.v[0x18] = (uVar30 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar164 + uVar174;
  uVar63 = local_830.v[0x18] ^ uVar63;
  uVar30 = uVar63 >> 0x10;
  local_830.v[0x69] = uVar63 << 0x30 | uVar30;
  local_830.v[0x48] =
       (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + local_830.v[0x69] + uVar150;
  uVar164 = local_830.v[0x48] ^ uVar164;
  local_830.v[0x39] = uVar164 << 1 | (ulong)((long)uVar164 < 0);
  uVar164 = (uVar7 & 0xffffffff | uVar131) * (uVar180 & 0xffffffff) * 2 + uVar133 + uVar180;
  uVar33 = uVar33 ^ uVar164;
  uVar7 = uVar33 >> 0x20;
  uVar63 = uVar33 << 0x20 | uVar7;
  uVar131 = uVar7 * (uVar64 & 0xffffffff) * 2 + uVar63 + uVar64;
  uVar133 = uVar133 ^ uVar131;
  uVar7 = uVar133 >> 0x18;
  uVar30 = uVar133 << 0x28 | uVar7;
  local_830.v[0x19] = (uVar7 & 0xffffffff) * (uVar164 & 0xffffffff) * 2 + uVar30 + uVar164;
  uVar63 = local_830.v[0x19] ^ uVar63;
  uVar7 = uVar63 >> 0x10;
  local_830.v[0x78] = uVar63 << 0x30 | uVar7;
  local_830.v[0x49] =
       (uVar7 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + local_830.v[0x78] + uVar131;
  uVar30 = local_830.v[0x49] ^ uVar30;
  local_830.v[0x28] = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar164 = (uVar166 & 0xffffffff) * (uVar171 & 0xffffffff) * 2 + uVar166 + uVar171;
  uVar189 = uVar189 ^ uVar164;
  uVar7 = uVar189 >> 0x20;
  uVar63 = uVar189 << 0x20 | uVar7;
  uVar131 = uVar7 * (uVar168 & 0xffffffff) * 2 + uVar63 + uVar168;
  uVar7 = (uVar166 ^ uVar131) >> 0x18;
  uVar30 = (uVar166 ^ uVar131) << 0x28 | uVar7;
  uVar179 = (uVar7 & 0xffffffff) * (uVar164 & 0xffffffff) * 2 + uVar30 + uVar164;
  uVar63 = uVar179 ^ uVar63;
  uVar7 = uVar63 >> 0x10;
  uVar134 = uVar63 << 0x30 | uVar7;
  uVar178 = (uVar7 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + uVar134 + uVar131;
  uVar30 = uVar178 ^ uVar30;
  uVar7 = uVar30 << 1;
  uVar131 = (ulong)((long)uVar30 < 0);
  uVar133 = uVar7 | uVar131;
  uVar174 = (uVar41 & 0xffffffff) * (uVar35 & 0xffffffff) * 2 + uVar41 + uVar35;
  uVar60 = uVar60 ^ uVar174;
  uVar30 = uVar60 >> 0x20;
  uVar164 = uVar60 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar54 & 0xffffffff) * 2 + uVar164 + uVar54;
  uVar30 = (uVar41 ^ uVar150) >> 0x18;
  uVar63 = (uVar41 ^ uVar150) << 0x28 | uVar30;
  uVar135 = (uVar30 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar63 + uVar174;
  uVar164 = uVar135 ^ uVar164;
  uVar30 = uVar164 >> 0x10;
  uVar147 = uVar164 << 0x30 | uVar30;
  uVar64 = (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + uVar147 + uVar150;
  uVar63 = uVar64 ^ uVar63;
  uVar30 = uVar63 << 1;
  uVar174 = (ulong)((long)uVar63 < 0);
  uVar70 = uVar30 | uVar174;
  uVar29 = (uVar167 & 0xffffffff) * (uVar165 & 0xffffffff) * 2 + uVar167 + uVar165;
  uVar146 = uVar146 ^ uVar29;
  uVar63 = uVar146 >> 0x20;
  uVar150 = uVar146 << 0x20 | uVar63;
  uVar132 = uVar63 * (uVar169 & 0xffffffff) * 2 + uVar150 + uVar169;
  uVar63 = (uVar167 ^ uVar132) >> 0x18;
  uVar164 = (uVar167 ^ uVar132) << 0x28 | uVar63;
  uVar181 = (uVar63 & 0xffffffff) * (uVar29 & 0xffffffff) * 2 + uVar164 + uVar29;
  uVar150 = uVar181 ^ uVar150;
  uVar63 = uVar150 >> 0x10;
  uVar33 = uVar150 << 0x30 | uVar63;
  uVar151 = (uVar63 & 0xffffffff) * (uVar132 & 0xffffffff) * 2 + uVar33 + uVar132;
  uVar164 = uVar164 ^ uVar151;
  uVar63 = uVar164 << 1;
  uVar150 = (ulong)((long)uVar164 < 0);
  uVar132 = uVar63 | uVar150;
  uVar180 = (uVar47 & 0xffffffff) * (uVar38 & 0xffffffff) * 2 + uVar47 + uVar38;
  uVar158 = uVar158 ^ uVar180;
  uVar164 = uVar158 >> 0x20;
  uVar34 = uVar158 << 0x20 | uVar164;
  uVar175 = uVar164 * (uVar57 & 0xffffffff) * 2 + uVar34 + uVar57;
  uVar164 = (uVar47 ^ uVar175) >> 0x18;
  uVar29 = (uVar47 ^ uVar175) << 0x28 | uVar164;
  uVar180 = (uVar164 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar29 + uVar180;
  uVar34 = uVar180 ^ uVar34;
  uVar164 = uVar34 >> 0x10;
  uVar152 = uVar34 << 0x30 | uVar164;
  uVar175 = (uVar164 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar152 + uVar175;
  uVar29 = uVar29 ^ uVar175;
  uVar164 = uVar29 << 1;
  uVar29 = (ulong)((long)uVar29 < 0);
  uVar34 = uVar164 | uVar29;
  uVar136 = (uVar30 & 0xffffffff | uVar174) * (uVar179 & 0xffffffff) * 2 + uVar70 + uVar179;
  uVar152 = uVar152 ^ uVar136;
  uVar30 = uVar152 >> 0x20;
  uVar179 = uVar152 << 0x20 | uVar30;
  uVar151 = uVar30 * (uVar151 & 0xffffffff) * 2 + uVar179 + uVar151;
  uVar70 = uVar70 ^ uVar151;
  uVar30 = uVar70 >> 0x18;
  uVar174 = uVar70 << 0x28 | uVar30;
  local_830.v[10] = (uVar30 & 0xffffffff) * (uVar136 & 0xffffffff) * 2 + uVar174 + uVar136;
  uVar179 = local_830.v[10] ^ uVar179;
  uVar30 = uVar179 >> 0x10;
  local_830.v[0x7b] = uVar179 << 0x30 | uVar30;
  local_830.v[0x5a] =
       (uVar30 & 0xffffffff) * (uVar151 & 0xffffffff) * 2 + local_830.v[0x7b] + uVar151;
  uVar174 = local_830.v[0x5a] ^ uVar174;
  local_830.v[0x2b] = uVar174 << 1 | (ulong)((long)uVar174 < 0);
  uVar70 = (uVar63 & 0xffffffff | uVar150) * (uVar135 & 0xffffffff) * 2 + uVar132 + uVar135;
  uVar134 = uVar134 ^ uVar70;
  uVar30 = uVar134 >> 0x20;
  uVar174 = uVar134 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar175 & 0xffffffff) * 2 + uVar174 + uVar175;
  uVar132 = uVar132 ^ uVar150;
  uVar30 = uVar132 >> 0x18;
  uVar63 = uVar132 << 0x28 | uVar30;
  local_830.v[0xb] = (uVar30 & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar63 + uVar70;
  uVar174 = local_830.v[0xb] ^ uVar174;
  uVar30 = uVar174 >> 0x10;
  local_830.v[0x6a] = uVar174 << 0x30 | uVar30;
  local_830.v[0x5b] =
       (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + local_830.v[0x6a] + uVar150;
  uVar63 = local_830.v[0x5b] ^ uVar63;
  local_830.v[0x3a] = uVar63 << 1 | (ulong)((long)uVar63 < 0);
  uVar174 = (uVar164 & 0xffffffff | uVar29) * (uVar181 & 0xffffffff) * 2 + uVar34 + uVar181;
  uVar147 = uVar147 ^ uVar174;
  uVar30 = uVar147 >> 0x20;
  uVar63 = uVar147 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar178 & 0xffffffff) * 2 + uVar63 + uVar178;
  uVar34 = uVar34 ^ uVar150;
  uVar30 = uVar34 >> 0x18;
  uVar164 = uVar34 << 0x28 | uVar30;
  local_830.v[0x1a] = (uVar30 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar164 + uVar174;
  uVar63 = local_830.v[0x1a] ^ uVar63;
  uVar30 = uVar63 >> 0x10;
  local_830.v[0x6b] = uVar63 << 0x30 | uVar30;
  local_830.v[0x4a] =
       (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + local_830.v[0x6b] + uVar150;
  uVar164 = local_830.v[0x4a] ^ uVar164;
  local_830.v[0x3b] = uVar164 << 1 | (ulong)((long)uVar164 < 0);
  uVar164 = (uVar7 & 0xffffffff | uVar131) * (uVar180 & 0xffffffff) * 2 + uVar133 + uVar180;
  uVar33 = uVar33 ^ uVar164;
  uVar7 = uVar33 >> 0x20;
  uVar63 = uVar33 << 0x20 | uVar7;
  uVar131 = uVar7 * (uVar64 & 0xffffffff) * 2 + uVar63 + uVar64;
  uVar133 = uVar133 ^ uVar131;
  uVar7 = uVar133 >> 0x18;
  uVar30 = uVar133 << 0x28 | uVar7;
  local_830.v[0x1b] = (uVar7 & 0xffffffff) * (uVar164 & 0xffffffff) * 2 + uVar30 + uVar164;
  uVar63 = local_830.v[0x1b] ^ uVar63;
  uVar7 = uVar63 >> 0x10;
  local_830.v[0x7a] = uVar63 << 0x30 | uVar7;
  local_830.v[0x4b] =
       (uVar7 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + local_830.v[0x7a] + uVar131;
  uVar30 = local_830.v[0x4b] ^ uVar30;
  local_830.v[0x2a] = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar164 = (uVar17 & 0xffffffff) * (uVar9 & 0xffffffff) * 2 + uVar90 + uVar74;
  uVar122 = uVar122 ^ uVar164;
  uVar7 = uVar122 >> 0x20;
  uVar63 = uVar122 << 0x20 | uVar7;
  uVar131 = uVar7 * (uVar25 & 0xffffffff) * 2 + uVar63 + uVar107;
  uVar7 = (uVar90 ^ uVar131) >> 0x18;
  uVar30 = (uVar90 ^ uVar131) << 0x28 | uVar7;
  uVar179 = (uVar7 & 0xffffffff) * (uVar164 & 0xffffffff) * 2 + uVar30 + uVar164;
  uVar63 = uVar179 ^ uVar63;
  uVar7 = uVar63 >> 0x10;
  uVar134 = uVar63 << 0x30 | uVar7;
  uVar178 = (uVar7 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + uVar134 + uVar131;
  uVar30 = uVar178 ^ uVar30;
  uVar7 = uVar30 << 1;
  uVar131 = (ulong)((long)uVar30 < 0);
  uVar133 = uVar7 | uVar131;
  uVar174 = (uVar18 & 0xffffffff) * (uVar10 & 0xffffffff) * 2 + uVar92 + uVar76;
  uVar123 = uVar123 ^ uVar174;
  uVar30 = uVar123 >> 0x20;
  uVar164 = uVar123 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar26 & 0xffffffff) * 2 + uVar164 + uVar109;
  uVar30 = (uVar92 ^ uVar150) >> 0x18;
  uVar63 = (uVar92 ^ uVar150) << 0x28 | uVar30;
  uVar135 = (uVar30 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar63 + uVar174;
  uVar164 = uVar135 ^ uVar164;
  uVar30 = uVar164 >> 0x10;
  uVar147 = uVar164 << 0x30 | uVar30;
  uVar64 = (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + uVar147 + uVar150;
  uVar63 = uVar64 ^ uVar63;
  uVar30 = uVar63 << 1;
  uVar174 = (ulong)((long)uVar63 < 0);
  uVar70 = uVar30 | uVar174;
  uVar29 = (uVar21 & 0xffffffff) * (uVar13 & 0xffffffff) * 2 + uVar98 + uVar82;
  uVar141 = uVar141 ^ uVar29;
  uVar63 = uVar141 >> 0x20;
  uVar150 = uVar141 << 0x20 | uVar63;
  uVar132 = uVar63 * (uVar188 & 0xffffffff) * 2 + uVar150 + uVar116;
  uVar63 = (uVar98 ^ uVar132) >> 0x18;
  uVar164 = (uVar98 ^ uVar132) << 0x28 | uVar63;
  uVar181 = (uVar63 & 0xffffffff) * (uVar29 & 0xffffffff) * 2 + uVar164 + uVar29;
  uVar150 = uVar181 ^ uVar150;
  uVar63 = uVar150 >> 0x10;
  uVar33 = uVar150 << 0x30 | uVar63;
  uVar151 = (uVar63 & 0xffffffff) * (uVar132 & 0xffffffff) * 2 + uVar33 + uVar132;
  uVar164 = uVar164 ^ uVar151;
  uVar63 = uVar164 << 1;
  uVar150 = (ulong)((long)uVar164 < 0);
  uVar132 = uVar63 | uVar150;
  uVar180 = (uVar22 & 0xffffffff) * (uVar14 & 0xffffffff) * 2 + uVar100 + uVar84;
  uVar142 = uVar142 ^ uVar180;
  uVar164 = uVar142 >> 0x20;
  uVar34 = uVar142 << 0x20 | uVar164;
  uVar175 = uVar164 * (uVar157 & 0xffffffff) * 2 + uVar34 + uVar118;
  uVar164 = (uVar100 ^ uVar175) >> 0x18;
  uVar29 = (uVar100 ^ uVar175) << 0x28 | uVar164;
  uVar180 = (uVar164 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar29 + uVar180;
  uVar34 = uVar180 ^ uVar34;
  uVar164 = uVar34 >> 0x10;
  uVar152 = uVar34 << 0x30 | uVar164;
  uVar175 = (uVar164 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar152 + uVar175;
  uVar29 = uVar29 ^ uVar175;
  uVar164 = uVar29 << 1;
  uVar29 = (ulong)((long)uVar29 < 0);
  uVar34 = uVar164 | uVar29;
  uVar136 = (uVar30 & 0xffffffff | uVar174) * (uVar179 & 0xffffffff) * 2 + uVar70 + uVar179;
  uVar152 = uVar152 ^ uVar136;
  uVar30 = uVar152 >> 0x20;
  uVar179 = uVar152 << 0x20 | uVar30;
  uVar151 = uVar30 * (uVar151 & 0xffffffff) * 2 + uVar179 + uVar151;
  uVar70 = uVar70 ^ uVar151;
  uVar30 = uVar70 >> 0x18;
  uVar174 = uVar70 << 0x28 | uVar30;
  local_830.v[0xc] = (uVar30 & 0xffffffff) * (uVar136 & 0xffffffff) * 2 + uVar174 + uVar136;
  uVar179 = local_830.v[0xc] ^ uVar179;
  uVar30 = uVar179 >> 0x10;
  local_830.v[0x7d] = uVar179 << 0x30 | uVar30;
  local_830.v[0x5c] =
       (uVar30 & 0xffffffff) * (uVar151 & 0xffffffff) * 2 + local_830.v[0x7d] + uVar151;
  uVar174 = local_830.v[0x5c] ^ uVar174;
  local_830.v[0x2d] = uVar174 << 1 | (ulong)((long)uVar174 < 0);
  uVar70 = (uVar63 & 0xffffffff | uVar150) * (uVar135 & 0xffffffff) * 2 + uVar132 + uVar135;
  uVar134 = uVar134 ^ uVar70;
  uVar30 = uVar134 >> 0x20;
  uVar174 = uVar134 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar175 & 0xffffffff) * 2 + uVar174 + uVar175;
  uVar132 = uVar132 ^ uVar150;
  uVar30 = uVar132 >> 0x18;
  uVar63 = uVar132 << 0x28 | uVar30;
  local_830.v[0xd] = (uVar30 & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar63 + uVar70;
  uVar174 = local_830.v[0xd] ^ uVar174;
  uVar30 = uVar174 >> 0x10;
  local_830.v[0x6c] = uVar174 << 0x30 | uVar30;
  local_830.v[0x5d] =
       (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + local_830.v[0x6c] + uVar150;
  uVar63 = local_830.v[0x5d] ^ uVar63;
  local_830.v[0x3c] = uVar63 << 1 | (ulong)((long)uVar63 < 0);
  uVar174 = (uVar164 & 0xffffffff | uVar29) * (uVar181 & 0xffffffff) * 2 + uVar34 + uVar181;
  uVar147 = uVar147 ^ uVar174;
  uVar30 = uVar147 >> 0x20;
  uVar63 = uVar147 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar178 & 0xffffffff) * 2 + uVar63 + uVar178;
  uVar34 = uVar34 ^ uVar150;
  uVar30 = uVar34 >> 0x18;
  uVar164 = uVar34 << 0x28 | uVar30;
  local_830.v[0x1c] = (uVar30 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar164 + uVar174;
  uVar63 = local_830.v[0x1c] ^ uVar63;
  uVar30 = uVar63 >> 0x10;
  local_830.v[0x6d] = uVar63 << 0x30 | uVar30;
  local_830.v[0x4c] =
       (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + local_830.v[0x6d] + uVar150;
  uVar164 = local_830.v[0x4c] ^ uVar164;
  local_830.v[0x3d] = uVar164 << 1 | (ulong)((long)uVar164 < 0);
  uVar164 = (uVar7 & 0xffffffff | uVar131) * (uVar180 & 0xffffffff) * 2 + uVar133 + uVar180;
  uVar33 = uVar33 ^ uVar164;
  uVar7 = uVar33 >> 0x20;
  uVar63 = uVar33 << 0x20 | uVar7;
  uVar131 = uVar7 * (uVar64 & 0xffffffff) * 2 + uVar63 + uVar64;
  uVar133 = uVar133 ^ uVar131;
  uVar7 = uVar133 >> 0x18;
  uVar30 = uVar133 << 0x28 | uVar7;
  local_830.v[0x1d] = (uVar7 & 0xffffffff) * (uVar164 & 0xffffffff) * 2 + uVar30 + uVar164;
  uVar63 = local_830.v[0x1d] ^ uVar63;
  uVar7 = uVar63 >> 0x10;
  local_830.v[0x7c] = uVar63 << 0x30 | uVar7;
  local_830.v[0x4d] =
       (uVar7 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + local_830.v[0x7c] + uVar131;
  uVar30 = local_830.v[0x4d] ^ uVar30;
  local_830.v[0x2c] = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar164 = (uVar19 & 0xffffffff) * (uVar11 & 0xffffffff) * 2 + uVar94 + uVar78;
  uVar124 = uVar124 ^ uVar164;
  uVar7 = uVar124 >> 0x20;
  uVar63 = uVar124 << 0x20 | uVar7;
  uVar131 = uVar7 * (uVar27 & 0xffffffff) * 2 + uVar63 + uVar111;
  uVar7 = (uVar94 ^ uVar131) >> 0x18;
  uVar30 = (uVar94 ^ uVar131) << 0x28 | uVar7;
  uVar179 = (uVar7 & 0xffffffff) * (uVar164 & 0xffffffff) * 2 + uVar30 + uVar164;
  uVar63 = uVar179 ^ uVar63;
  uVar7 = uVar63 >> 0x10;
  uVar151 = uVar63 << 0x30 | uVar7;
  uVar134 = (uVar7 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + uVar151 + uVar131;
  uVar30 = uVar134 ^ uVar30;
  uVar7 = uVar30 << 1;
  uVar131 = (ulong)((long)uVar30 < 0);
  uVar133 = uVar7 | uVar131;
  uVar174 = (uVar16 & 0xffffffff) * (uVar8 & 0xffffffff) * 2 + uVar88 + uVar72;
  uVar69 = uVar69 ^ uVar174;
  uVar30 = uVar69 >> 0x20;
  uVar164 = uVar69 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar24 & 0xffffffff) * 2 + uVar164 + uVar105;
  uVar30 = (uVar88 ^ uVar150) >> 0x18;
  uVar63 = (uVar88 ^ uVar150) << 0x28 | uVar30;
  uVar135 = (uVar30 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar63 + uVar174;
  uVar164 = uVar135 ^ uVar164;
  uVar30 = uVar164 >> 0x10;
  uVar147 = uVar164 << 0x30 | uVar30;
  uVar33 = (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + uVar147 + uVar150;
  uVar63 = uVar33 ^ uVar63;
  uVar30 = uVar63 << 1;
  uVar174 = (ulong)((long)uVar63 < 0);
  uVar64 = uVar30 | uVar174;
  uVar29 = (uVar23 & 0xffffffff) * (uVar15 & 0xffffffff) * 2 + uVar102 + uVar86;
  uVar149 = uVar149 ^ uVar29;
  uVar63 = uVar149 >> 0x20;
  uVar150 = uVar149 << 0x20 | uVar63;
  uVar132 = uVar63 * (uVar139 & 0xffffffff) * 2 + uVar150 + uVar120;
  uVar63 = (uVar102 ^ uVar132) >> 0x18;
  uVar164 = (uVar102 ^ uVar132) << 0x28 | uVar63;
  uVar181 = (uVar63 & 0xffffffff) * (uVar29 & 0xffffffff) * 2 + uVar164 + uVar29;
  uVar150 = uVar181 ^ uVar150;
  uVar63 = uVar150 >> 0x10;
  uVar70 = uVar150 << 0x30 | uVar63;
  uVar178 = (uVar63 & 0xffffffff) * (uVar132 & 0xffffffff) * 2 + uVar70 + uVar132;
  uVar164 = uVar164 ^ uVar178;
  uVar63 = uVar164 << 1;
  uVar150 = (ulong)((long)uVar164 < 0);
  uVar132 = uVar63 | uVar150;
  uVar180 = (uVar20 & 0xffffffff) * (uVar12 & 0xffffffff) * 2 + uVar96 + uVar80;
  uVar67 = uVar67 ^ uVar180;
  uVar164 = uVar67 >> 0x20;
  uVar34 = uVar67 << 0x20 | uVar164;
  uVar175 = uVar164 * (uVar28 & 0xffffffff) * 2 + uVar34 + uVar114;
  uVar164 = (uVar96 ^ uVar175) >> 0x18;
  uVar29 = (uVar96 ^ uVar175) << 0x28 | uVar164;
  uVar180 = (uVar164 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar29 + uVar180;
  uVar34 = uVar180 ^ uVar34;
  uVar164 = uVar34 >> 0x10;
  uVar152 = uVar34 << 0x30 | uVar164;
  uVar175 = (uVar164 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar152 + uVar175;
  uVar29 = uVar29 ^ uVar175;
  uVar164 = uVar29 << 1;
  uVar29 = (ulong)((long)uVar29 < 0);
  uVar34 = uVar164 | uVar29;
  uVar136 = (uVar30 & 0xffffffff | uVar174) * (uVar179 & 0xffffffff) * 2 + uVar64 + uVar179;
  uVar152 = uVar152 ^ uVar136;
  uVar30 = uVar152 >> 0x20;
  uVar179 = uVar152 << 0x20 | uVar30;
  uVar178 = uVar30 * (uVar178 & 0xffffffff) * 2 + uVar179 + uVar178;
  uVar64 = uVar64 ^ uVar178;
  uVar30 = uVar64 >> 0x18;
  uVar174 = uVar64 << 0x28 | uVar30;
  local_830.v[0xe] = (uVar30 & 0xffffffff) * (uVar136 & 0xffffffff) * 2 + uVar136 + uVar174;
  uVar179 = local_830.v[0xe] ^ uVar179;
  uVar30 = uVar179 >> 0x10;
  local_830.v[0x7f] = uVar179 << 0x30 | uVar30;
  local_830.v[0x5e] =
       (uVar30 & 0xffffffff) * (uVar178 & 0xffffffff) * 2 + local_830.v[0x7f] + uVar178;
  uVar174 = local_830.v[0x5e] ^ uVar174;
  local_830.v[0x2f] = uVar174 << 1 | (ulong)((long)uVar174 < 0);
  uVar174 = (uVar63 & 0xffffffff | uVar150) * (uVar135 & 0xffffffff) * 2 + uVar132 + uVar135;
  uVar151 = uVar151 ^ uVar174;
  uVar30 = uVar151 >> 0x20;
  uVar150 = uVar151 << 0x20 | uVar30;
  uVar64 = uVar30 * (uVar175 & 0xffffffff) * 2 + uVar150 + uVar175;
  uVar132 = uVar132 ^ uVar64;
  uVar30 = uVar132 >> 0x18;
  uVar63 = uVar132 << 0x28 | uVar30;
  local_830.v[0xf] = (uVar30 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar174 + uVar63;
  uVar150 = local_830.v[0xf] ^ uVar150;
  uVar30 = uVar150 >> 0x10;
  local_830.v[0x6e] = uVar150 << 0x30 | uVar30;
  local_830.v[0x5f] = (uVar30 & 0xffffffff) * (uVar64 & 0xffffffff) * 2 + local_830.v[0x6e] + uVar64
  ;
  uVar63 = local_830.v[0x5f] ^ uVar63;
  local_830.v[0x3e] = uVar63 << 1 | (ulong)((long)uVar63 < 0);
  uVar174 = (uVar164 & 0xffffffff | uVar29) * (uVar181 & 0xffffffff) * 2 + uVar34 + uVar181;
  uVar147 = uVar147 ^ uVar174;
  uVar30 = uVar147 >> 0x20;
  uVar63 = uVar147 << 0x20 | uVar30;
  uVar150 = uVar30 * (uVar134 & 0xffffffff) * 2 + uVar63 + uVar134;
  uVar34 = uVar34 ^ uVar150;
  uVar30 = uVar34 >> 0x18;
  uVar164 = uVar34 << 0x28 | uVar30;
  local_830.v[0x1e] = (uVar30 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar164 + uVar174;
  uVar63 = local_830.v[0x1e] ^ uVar63;
  uVar30 = uVar63 >> 0x10;
  local_830.v[0x6f] = uVar63 << 0x30 | uVar30;
  local_830.v[0x4e] =
       (uVar30 & 0xffffffff) * (uVar150 & 0xffffffff) * 2 + local_830.v[0x6f] + uVar150;
  uVar164 = local_830.v[0x4e] ^ uVar164;
  local_830.v[0x3f] = uVar164 << 1 | (ulong)((long)uVar164 < 0);
  uVar63 = (uVar7 & 0xffffffff | uVar131) * (uVar180 & 0xffffffff) * 2 + uVar133 + uVar180;
  uVar70 = uVar70 ^ uVar63;
  uVar7 = uVar70 >> 0x20;
  uVar164 = uVar70 << 0x20 | uVar7;
  uVar131 = uVar7 * (uVar33 & 0xffffffff) * 2 + uVar164 + uVar33;
  uVar133 = uVar133 ^ uVar131;
  uVar7 = uVar133 >> 0x18;
  uVar30 = uVar133 << 0x28 | uVar7;
  local_830.v[0x1f] = (uVar7 & 0xffffffff) * (uVar63 & 0xffffffff) * 2 + uVar63 + uVar30;
  uVar164 = local_830.v[0x1f] ^ uVar164;
  uVar7 = uVar164 >> 0x10;
  local_830.v[0x7e] = uVar164 << 0x30 | uVar7;
  local_830.v[0x4f] =
       (uVar7 & 0xffffffff) * (uVar131 & 0xffffffff) * 2 + local_830.v[0x7e] + uVar131;
  uVar30 = local_830.v[0x4f] ^ uVar30;
  local_830.v[0x2e] = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  copy_block(next_block,&local_430);
  xor_block(next_block,&local_830);
  return;
}

Assistant:

static void fill_block(const block *prev_block, const block *ref_block,
                       block *next_block, int with_xor)
{
    block blockR, block_tmp;

    copy_block(&blockR, ref_block);
    xor_block(&blockR, prev_block);
    copy_block(&block_tmp, &blockR);
    if (with_xor) {
        xor_block(&block_tmp, next_block);
    }

    /* Apply Blake2 on columns of 64-bit words: (0,1,...,15) , then
    (16,17,..31)... finally (112,113,...127) */
    BLAKE2_ROUND_NOMSG1(blockR.v + 0 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 1 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 2 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 3 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 4 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 5 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 6 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 7 * 16);

    /* Apply Blake2 on rows of 64-bit words: (0,1,16,17,...112,113), then
    (2,3,18,19,...,114,115).. finally (14,15,30,31,...,126,127) */
    BLAKE2_ROUND_NOMSG2(blockR.v + 0 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 1 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 2 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 3 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 4 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 5 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 6 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 7 * 2);

    copy_block(next_block, &block_tmp);
    xor_block(next_block, &blockR);
}